

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

void estimate_space_upto_test(bool multi_kv)

{
  fdb_encryption_key *__s;
  short *psVar1;
  size_t *psVar2;
  fdb_status fVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  uint64_t extraout_RAX;
  uint64_t uVar9;
  fdb_kvs_handle *pfVar10;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar11;
  __atomic_base<unsigned_long> doc;
  fdb_kvs_handle *pfVar12;
  fdb_kvs_config *kvs_config_00;
  fdb_kvs_commit_marker_t *pfVar13;
  fdb_file_info *kvs_config_01;
  char *pcVar14;
  void *__s2;
  size_t sVar15;
  code *__s_00;
  list *ptr_handle;
  fdb_kvs_handle **ppfVar16;
  char cVar17;
  uint uVar18;
  fdb_kvs_handle *pfVar19;
  fdb_file_info *info;
  undefined7 in_register_00000039;
  fdb_file_handle *pfVar20;
  fdb_kvs_handle *pfVar21;
  undefined1 handle [8];
  fdb_kvs_handle *handle_00;
  ulong uVar22;
  __atomic_base<unsigned_long> _Var23;
  long lVar24;
  filemgr *ptr_fhandle;
  fdb_config *pfVar25;
  ulong uVar26;
  size_t sVar27;
  char *pcVar28;
  char *pcVar29;
  btree *ptr_fhandle_00;
  fdb_doc **ppfVar30;
  timeval tVar31;
  timeval tVar32;
  fdb_file_handle *dbfile;
  fdb_snapshot_info_t *markers;
  uint64_t num_markers;
  fdb_kvs_config kvs_config;
  char kv_name [8];
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_17078;
  undefined1 auStack_17070 [16];
  undefined1 auStack_17060 [8];
  undefined1 auStack_17058 [80];
  ulong uStack_17008;
  timeval tStack_16fe8;
  fdb_file_info afStack_16fd8 [3];
  fdb_file_info afStack_16ed8 [3];
  fdb_config fStack_16dd8;
  filemgr *pfStack_16ce0;
  fdb_kvs_handle *pfStack_16cd8;
  fdb_kvs_handle *pfStack_16cd0;
  fdb_config *pfStack_16cc8;
  fdb_kvs_handle *pfStack_16cc0;
  fdb_kvs_handle *pfStack_16cb8;
  fdb_file_handle *pfStack_16ca8;
  fdb_kvs_handle *pfStack_16ca0;
  timeval atStack_16c98 [2];
  timeval tStack_16c78;
  timeval tStack_16c68;
  undefined1 auStack_16c58 [70];
  undefined1 uStack_16c12;
  undefined8 uStack_16c08;
  filemgr *pfStack_16b48;
  fdb_kvs_handle *pfStack_16b40;
  fdb_kvs_handle *pfStack_16b38;
  filemgr *pfStack_16b30;
  fdb_kvs_handle *pfStack_16b28;
  fdb_kvs_handle *pfStack_16b20;
  undefined1 auStack_16b10 [8];
  undefined1 auStack_16b08 [8];
  undefined1 auStack_16b00 [8];
  undefined1 auStack_16af8 [16];
  undefined1 auStack_16ae8 [16];
  fdb_kvs_config fStack_16ad8;
  atomic<unsigned_long> aStack_16ac0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_16ab8;
  __atomic_base<unsigned_long> _Stack_16ab0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_16aa8;
  undefined1 auStack_16aa0 [8];
  undefined1 auStack_16a98 [16];
  undefined1 auStack_16a88 [16];
  atomic<unsigned_long> aStack_16a78;
  fdb_open_flags fStack_16a64;
  ushort uStack_16a5a;
  filemgr *pfStack_16a50;
  atomic<unsigned_long> aStack_16a10;
  undefined1 auStack_16990 [16];
  timeval tStack_16980;
  undefined1 auStack_16970 [328];
  char acStack_16828 [256];
  char acStack_16728 [256];
  fdb_kvs_handle afStack_16628 [153];
  fdb_kvs_handle *pfStack_2d60;
  fdb_kvs_handle *pfStack_2d58;
  list *plStack_2d50;
  void *pvStack_2d48;
  fdb_kvs_config fStack_2d40;
  fdb_kvs_info fStack_2d28;
  timeval tStack_2cf8;
  fdb_config fStack_2ce8;
  char acStack_2bf0 [256];
  fdb_kvs_handle afStack_2af0 [2];
  fdb_kvs_handle **ppfStack_25c8;
  fdb_kvs_handle *pfStack_25c0;
  fdb_kvs_handle *pfStack_25b8;
  fdb_kvs_config *pfStack_25b0;
  fdb_kvs_handle *pfStack_25a8;
  fdb_kvs_handle *pfStack_25a0;
  undefined1 auStack_2588 [16];
  undefined1 auStack_2578 [32];
  fdb_kvs_handle *pfStack_2558;
  fdb_kvs_config fStack_2550;
  fdb_kvs_info fStack_2538;
  timeval tStack_2508;
  char acStack_24f8 [256];
  undefined1 auStack_23f8 [752];
  char acStack_2108 [256];
  fdb_kvs_handle fStack_2008;
  fdb_doc **ppfStack_1e00;
  fdb_kvs_handle *pfStack_1df8;
  undefined1 auStack_1de0 [16];
  fdb_doc *pfStack_1dd0;
  fdb_kvs_handle *pfStack_1dc8;
  fdb_doc *apfStack_1dc0 [11];
  timeval tStack_1d68;
  undefined1 auStack_1d58 [536];
  char acStack_1b40 [256];
  stat sStack_1a40;
  fdb_config fStack_19b0;
  fdb_kvs_handle **ppfStack_18b8;
  fdb_kvs_handle *pfStack_18b0;
  fdb_kvs_handle *pfStack_18a8;
  fdb_kvs_handle *pfStack_18a0;
  btree *pbStack_1898;
  fdb_kvs_handle *pfStack_1890;
  fdb_kvs_handle *pfStack_1880;
  fdb_kvs_handle *pfStack_1878;
  fdb_file_handle *pfStack_1870;
  fdb_kvs_handle *pfStack_1868;
  undefined1 auStack_1860 [32];
  undefined1 auStack_1840 [40];
  fdb_file_info fStack_1818;
  fdb_config fStack_17d0;
  btree abStack_16d8 [4];
  char acStack_15d8 [256];
  char acStack_14d8 [264];
  code *pcStack_13d0;
  fdb_kvs_handle *pfStack_13c8;
  fdb_kvs_handle *pfStack_13c0;
  char *pcStack_13b8;
  char *pcStack_13b0;
  fdb_kvs_handle *pfStack_13a8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1390;
  fdb_file_handle *pfStack_1388;
  fdb_kvs_handle *pfStack_1380;
  int iStack_1374;
  undefined1 auStack_1370 [64];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1330;
  fdb_kvs_config fStack_1308;
  timeval tStack_12f0;
  char acStack_12e0 [256];
  fdb_doc *apfStack_11e0 [20];
  undefined1 auStack_1140 [520];
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined4 uStack_f1c;
  undefined1 uStack_f11;
  undefined1 uStack_f00;
  undefined8 uStack_e88;
  size_t sStack_e48;
  size_t sStack_e40;
  fdb_doc **ppfStack_e38;
  char *pcStack_e30;
  code *pcStack_e28;
  code *pcStack_e20;
  fdb_file_handle *local_e08;
  fdb_snapshot_info_t *local_e00;
  uint64_t local_df8;
  uint local_dec;
  fdb_kvs_handle *local_de8 [4];
  fdb_kvs_config local_dc8;
  char local_db0 [8];
  timeval local_da8;
  char local_d98 [256];
  char local_c98 [256];
  char local_b98 [264];
  fdb_config local_a90;
  fdb_doc *local_998 [301];
  
  pcStack_e20 = (code *)0x10dceb;
  gettimeofday(&local_da8,(__timezone_ptr_t)0x0);
  pcStack_e20 = (code *)0x10dcf0;
  memleak_start();
  pcStack_e20 = (code *)0x10dd00;
  fdb_get_default_config();
  pcStack_e20 = (code *)0x10dd0a;
  fdb_get_default_kvs_config();
  local_a90.buffercache_size = 0;
  local_a90.wal_threshold = 0x32;
  local_a90.flags = 1;
  local_a90.compaction_threshold = '\0';
  local_a90.block_reusing_threshold = 0;
  pcStack_e20 = (code *)0x10dd38;
  local_a90.multi_kv_instances = multi_kv;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_e20 = (code *)0x10dd4c;
  fdb_open(&local_e08,"./compact_test1",&local_a90);
  local_dec = (uint)CONCAT71(in_register_00000039,multi_kv);
  if (local_dec == 0) {
    pcStack_e20 = (code *)0x10ddb8;
    fdb_kvs_open_default(local_e08,local_de8,&local_dc8);
    sVar15 = 1;
  }
  else {
    ppfVar16 = local_de8;
    uVar22 = 0;
    do {
      pcStack_e20 = (code *)0x10dd7d;
      sprintf(local_db0,"kv%d",uVar22 & 0xffffffff);
      pcStack_e20 = (code *)0x10dd90;
      fdb_kvs_open(local_e08,ppfVar16,local_db0,&local_dc8);
      uVar22 = uVar22 + 1;
      ppfVar16 = ppfVar16 + 1;
    } while (uVar22 != 4);
    sVar15 = 4;
  }
  uVar22 = 0;
  do {
    pcStack_e20 = (code *)0x10dddc;
    sprintf(local_b98,"key%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10ddf5;
    sprintf(local_c98,"meta%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10de0e;
    sprintf(local_d98,"body%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10de21;
    sVar5 = strlen(local_b98);
    pcStack_e20 = (code *)0x10de34;
    sVar6 = strlen(local_c98);
    pcStack_e20 = (code *)0x10de44;
    sVar7 = strlen(local_d98);
    pcStack_e20 = (code *)0x10de69;
    fdb_doc_create(local_998 + uVar22,local_b98,sVar5,local_c98,sVar6,local_d98,sVar7);
    sVar27 = 0;
    do {
      pcStack_e20 = (code *)0x10de7a;
      fdb_set(local_de8[sVar27],local_998[uVar22]);
      sVar27 = sVar27 + 1;
    } while (sVar15 != sVar27);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 0x4b);
  pcStack_e20 = (code *)0x10de9e;
  fdb_commit(local_e08,'\x01');
  uVar22 = 0x4b;
  do {
    pcStack_e20 = (code *)0x10dec0;
    sprintf(local_b98,"key%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10ded9;
    sprintf(local_c98,"meta%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10def2;
    sprintf(local_d98,"body%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10df05;
    sVar5 = strlen(local_b98);
    pcStack_e20 = (code *)0x10df18;
    sVar6 = strlen(local_c98);
    pcStack_e20 = (code *)0x10df28;
    sVar7 = strlen(local_d98);
    pcStack_e20 = (code *)0x10df4d;
    fdb_doc_create(local_998 + uVar22,local_b98,sVar5,local_c98,sVar6,local_d98,sVar7);
    sVar27 = 0;
    do {
      pcStack_e20 = (code *)0x10df5e;
      fdb_set(local_de8[sVar27],local_998[uVar22]);
      sVar27 = sVar27 + 1;
    } while (sVar15 != sVar27);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 0x96);
  lVar24 = 0;
  do {
    sVar27 = 0;
    do {
      pcStack_e20 = (code *)0x10df8e;
      fdb_set(local_de8[sVar27],local_998[lVar24]);
      sVar27 = sVar27 + 1;
    } while (sVar15 != sVar27);
    lVar24 = lVar24 + 1;
  } while (lVar24 != 0x4b);
  lVar24 = 0;
  do {
    sVar27 = 0;
    do {
      pcStack_e20 = (code *)0x10dfb7;
      fdb_set(local_de8[sVar27],local_998[lVar24]);
      sVar27 = sVar27 + 1;
    } while (sVar15 != sVar27);
    lVar24 = lVar24 + 1;
  } while (lVar24 != 0x4b);
  pcStack_e20 = (code *)0x10dfd4;
  fdb_commit(local_e08,'\0');
  uVar22 = 0x96;
  do {
    pcStack_e20 = (code *)0x10dff6;
    sprintf(local_b98,"key%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10e00f;
    sprintf(local_c98,"meta%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10e028;
    sprintf(local_d98,"body%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10e03b;
    sVar5 = strlen(local_b98);
    pcStack_e20 = (code *)0x10e04e;
    sVar6 = strlen(local_c98);
    pcStack_e20 = (code *)0x10e05e;
    sVar7 = strlen(local_d98);
    pcStack_e20 = (code *)0x10e083;
    fdb_doc_create(local_998 + uVar22,local_b98,sVar5,local_c98,sVar6,local_d98,sVar7);
    sVar27 = 0;
    do {
      pcStack_e20 = (code *)0x10e094;
      fdb_set(local_de8[sVar27],local_998[uVar22]);
      sVar27 = sVar27 + 1;
    } while (sVar15 != sVar27);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 0xe1);
  pcStack_e20 = (code *)0x10e0bb;
  fdb_commit(local_e08,'\x01');
  uVar22 = 0xe1;
  do {
    pcStack_e20 = (code *)0x10e0dd;
    sprintf(local_b98,"key%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10e0f6;
    sprintf(local_c98,"meta%d",uVar22 & 0xffffffff);
    pcStack_e20 = (code *)0x10e10f;
    sprintf(local_d98,"body%d",uVar22 & 0xffffffff);
    ppfVar30 = local_998 + uVar22;
    pcStack_e20 = (code *)0x10e122;
    sVar5 = strlen(local_b98);
    pcStack_e20 = (code *)0x10e135;
    sVar6 = strlen(local_c98);
    pcStack_e20 = (code *)0x10e145;
    sVar7 = strlen(local_d98);
    pcStack_e20 = (code *)0x10e16a;
    fdb_doc_create(ppfVar30,local_b98,sVar5,local_c98,sVar6,local_d98,sVar7);
    sVar27 = 0;
    do {
      pcStack_e20 = (code *)0x10e17b;
      fdb_set(local_de8[sVar27],*ppfVar30);
      sVar27 = sVar27 + 1;
    } while (sVar15 != sVar27);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 300);
  sVar27 = 0;
  pcStack_e20 = (code *)0x10e1a2;
  fdb_commit(local_e08,'\0');
  do {
    pfVar10 = local_de8[sVar27];
    pcStack_e20 = (code *)0x10e1c0;
    fVar3 = fdb_set_log_callback(pfVar10,logCallbackFunc,"estimate_space_upto_test");
    iVar4 = (int)pfVar10;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_e20 = (code *)0x10e337;
      estimate_space_upto_test();
      goto LAB_0010e337;
    }
    sVar27 = sVar27 + 1;
  } while (sVar15 != sVar27);
  pcStack_e20 = (code *)0x10e1e4;
  pfVar20 = local_e08;
  fVar3 = fdb_get_all_snap_markers(local_e08,&local_e00,&local_df8);
  iVar4 = (int)pfVar20;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    sVar5 = (size_t)local_dec;
    cVar17 = (char)local_dec;
    uVar9 = local_df8;
    if (cVar17 != '\0') {
      if (local_df8 != 8) {
        pcStack_e20 = (code *)0x10e20a;
        estimate_space_upto_test();
      }
      pcStack_e20 = (code *)0x10e21d;
      sVar15 = fdb_estimate_space_used_from(local_e08,local_e00[1].marker);
      pcStack_e20 = (code *)0x10e233;
      sVar8 = fdb_estimate_space_used_from(local_e08,local_e00[2].marker);
      if (sVar8 <= sVar15) {
        pcStack_e20 = (code *)0x10e23d;
        estimate_space_upto_test();
        uVar9 = extraout_RAX;
        goto LAB_0010e23d;
      }
LAB_0010e27f:
      pcStack_e20 = (code *)0x10e28e;
      fVar3 = fdb_free_snap_markers(local_e00,local_df8);
      iVar4 = (int)local_e00;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pcStack_e20 = (code *)0x10e2a0;
        fdb_close(local_e08);
        lVar24 = 0;
        do {
          pcStack_e20 = (code *)0x10e2af;
          fdb_doc_free(local_998[lVar24]);
          lVar24 = lVar24 + 1;
        } while (lVar24 != 300);
        pcStack_e20 = (code *)0x10e2c0;
        fdb_shutdown();
        pcStack_e20 = (code *)0x10e2c5;
        memleak_end();
        pcVar14 = "single kv mode:";
        if (cVar17 != '\0') {
          pcVar14 = "multiple kv mode:";
        }
        pcStack_e20 = (code *)0x10e2f3;
        sprintf(local_d98,"estimate space upto marker in file test %s",pcVar14);
        pcVar14 = "%s PASSED\n";
        if (estimate_space_upto_test(bool)::__test_pass != '\0') {
          pcVar14 = "%s FAILED\n";
        }
        pcStack_e20 = (code *)0x10e320;
        fprintf(_stderr,pcVar14,local_d98);
        return;
      }
      goto LAB_0010e33c;
    }
LAB_0010e23d:
    if (uVar9 != 4) {
      pcStack_e20 = (code *)0x10e24d;
      estimate_space_upto_test();
    }
    pcStack_e20 = (code *)0x10e260;
    sVar15 = fdb_estimate_space_used_from(local_e08,local_e00[1].marker);
    pcStack_e20 = (code *)0x10e276;
    pfVar20 = local_e08;
    sVar8 = fdb_estimate_space_used_from(local_e08,local_e00[2].marker);
    iVar4 = (int)pfVar20;
    if (sVar15 < sVar8) goto LAB_0010e27f;
  }
  else {
LAB_0010e337:
    pcStack_e20 = (code *)0x10e33c;
    estimate_space_upto_test();
LAB_0010e33c:
    pcStack_e20 = (code *)0x10e341;
    estimate_space_upto_test();
  }
  pcStack_e20 = compact_upto_test;
  estimate_space_upto_test();
  pcStack_e28 = logCallbackFunc;
  pcStack_e30 = "estimate_space_upto_test";
  pfStack_13a8 = (fdb_kvs_handle *)0x10e36b;
  sStack_e48 = sVar15;
  sStack_e40 = sVar27;
  ppfStack_e38 = ppfVar30;
  pcStack_e20 = (code *)sVar5;
  gettimeofday(&tStack_12f0,(__timezone_ptr_t)0x0);
  pfStack_13a8 = (fdb_kvs_handle *)0x10e370;
  memleak_start();
  pfStack_13a8 = (fdb_kvs_handle *)0x10e380;
  fdb_get_default_config();
  pfStack_13a8 = (fdb_kvs_handle *)0x10e38d;
  fdb_get_default_kvs_config();
  uStack_f38 = 0;
  uStack_f30 = 0x400;
  uStack_f1c = 1;
  uStack_f11 = 0;
  uStack_e88 = 0;
  pfStack_13a8 = (fdb_kvs_handle *)0x10e3bb;
  uStack_f00 = (char)iVar4;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_13a8 = (fdb_kvs_handle *)0x10e3cf;
  fdb_open(&pfStack_1388,"./compact_test1",(fdb_config *)(auStack_1140 + 0x200));
  iStack_1374 = iVar4;
  if (iVar4 == 0) {
    pfStack_13a8 = (fdb_kvs_handle *)0x10e441;
    fdb_kvs_open_default(pfStack_1388,(fdb_kvs_handle **)(auStack_1370 + 0x20),&fStack_1308);
    uVar18 = 1;
  }
  else {
    ppfVar16 = (fdb_kvs_handle **)(auStack_1370 + 0x20);
    uVar22 = 0;
    do {
      pfStack_13a8 = (fdb_kvs_handle *)0x10e403;
      sprintf(auStack_1370,"kv%d",uVar22 & 0xffffffff);
      pfStack_13a8 = (fdb_kvs_handle *)0x10e416;
      fdb_kvs_open(pfStack_1388,ppfVar16,auStack_1370,&fStack_1308);
      uVar22 = uVar22 + 1;
      ppfVar16 = ppfVar16 + 1;
    } while (uVar22 != 4);
    uVar18 = 4;
  }
  pcVar14 = (char *)(ulong)uVar18;
  uVar22 = 0;
  do {
    pfStack_13a8 = (fdb_kvs_handle *)0x10e466;
    sprintf(auStack_1140 + 0x100,"key%d",uVar22 & 0xffffffff);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e47e;
    sprintf(auStack_1140,"meta%d",uVar22 & 0xffffffff);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e496;
    sprintf(acStack_12e0,"body%d",uVar22 & 0xffffffff);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e4a9;
    sVar5 = strlen(auStack_1140 + 0x100);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e4bc;
    sVar6 = strlen(auStack_1140);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e4cc;
    sVar7 = strlen(acStack_12e0);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e4f1;
    fdb_doc_create(apfStack_11e0 + uVar22,auStack_1140 + 0x100,sVar5,auStack_1140,sVar6,acStack_12e0
                   ,sVar7);
    lVar24 = 0;
    do {
      pfStack_13a8 = (fdb_kvs_handle *)0x10e501;
      fdb_set(*(fdb_kvs_handle **)(auStack_1370 + lVar24 * 8 + 0x20),apfStack_11e0[uVar22]);
      lVar24 = lVar24 + 1;
    } while (pcVar14 != (char *)lVar24);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 5);
  pfStack_13a8 = (fdb_kvs_handle *)0x10e525;
  fdb_commit(pfStack_1388,'\x01');
  uVar22 = 5;
  do {
    pfStack_13a8 = (fdb_kvs_handle *)0x10e545;
    sprintf(auStack_1140 + 0x100,"key%d",uVar22 & 0xffffffff);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e55d;
    sprintf(auStack_1140,"meta%d",uVar22 & 0xffffffff);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e575;
    sprintf(acStack_12e0,"body%d",uVar22 & 0xffffffff);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e588;
    sVar5 = strlen(auStack_1140 + 0x100);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e59b;
    sVar6 = strlen(auStack_1140);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e5ab;
    sVar7 = strlen(acStack_12e0);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e5d0;
    fdb_doc_create(apfStack_11e0 + uVar22,auStack_1140 + 0x100,sVar5,auStack_1140,sVar6,acStack_12e0
                   ,sVar7);
    lVar24 = 0;
    do {
      pfStack_13a8 = (fdb_kvs_handle *)0x10e5e1;
      fdb_set(*(fdb_kvs_handle **)(auStack_1370 + lVar24 * 8 + 0x20),apfStack_11e0[uVar22]);
      lVar24 = lVar24 + 1;
    } while (pcVar14 != (char *)lVar24);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 10);
  pfStack_13a8 = (fdb_kvs_handle *)0x10e602;
  fdb_commit(pfStack_1388,'\0');
  uVar22 = 10;
  do {
    pfStack_13a8 = (fdb_kvs_handle *)0x10e622;
    sprintf(auStack_1140 + 0x100,"key%d",uVar22 & 0xffffffff);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e63a;
    sprintf(auStack_1140,"meta%d",uVar22 & 0xffffffff);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e652;
    sprintf(acStack_12e0,"body%d",uVar22 & 0xffffffff);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e665;
    sVar5 = strlen(auStack_1140 + 0x100);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e678;
    sVar6 = strlen(auStack_1140);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e688;
    sVar7 = strlen(acStack_12e0);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e6ad;
    fdb_doc_create(apfStack_11e0 + uVar22,auStack_1140 + 0x100,sVar5,auStack_1140,sVar6,acStack_12e0
                   ,sVar7);
    lVar24 = 0;
    do {
      pfStack_13a8 = (fdb_kvs_handle *)0x10e6be;
      fdb_set(*(fdb_kvs_handle **)(auStack_1370 + lVar24 * 8 + 0x20),apfStack_11e0[uVar22]);
      lVar24 = lVar24 + 1;
    } while (pcVar14 != (char *)lVar24);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 0xf);
  pfStack_13a8 = (fdb_kvs_handle *)0x10e6e2;
  fdb_commit(pfStack_1388,'\x01');
  uVar22 = 0xf;
  do {
    pfStack_13a8 = (fdb_kvs_handle *)0x10e702;
    sprintf(auStack_1140 + 0x100,"key%d",uVar22 & 0xffffffff);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e71a;
    sprintf(auStack_1140,"meta%d",uVar22 & 0xffffffff);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e732;
    sprintf(acStack_12e0,"body%d",uVar22 & 0xffffffff);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e745;
    pfVar10 = (fdb_kvs_handle *)strlen(auStack_1140 + 0x100);
    doc._M_i = (__int_type_conflict)auStack_1140;
    pfStack_13a8 = (fdb_kvs_handle *)0x10e758;
    sVar5 = strlen((char *)doc._M_i);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e768;
    sVar6 = strlen(acStack_12e0);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e78d;
    fdb_doc_create(apfStack_11e0 + uVar22,auStack_1140 + 0x100,(size_t)pfVar10,(void *)doc._M_i,
                   sVar5,acStack_12e0,sVar6);
    lVar24 = 0;
    do {
      pfStack_13a8 = (fdb_kvs_handle *)0x10e79e;
      fdb_set(*(fdb_kvs_handle **)(auStack_1370 + lVar24 * 8 + 0x20),apfStack_11e0[uVar22]);
      lVar24 = lVar24 + 1;
    } while (pcVar14 != (char *)lVar24);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 0x14);
  handle_00 = (fdb_kvs_handle *)0x0;
  pfStack_13a8 = (fdb_kvs_handle *)0x10e7c2;
  fdb_commit(pfStack_1388,'\0');
  __s_00 = logCallbackFunc;
  pcVar28 = "compact_upto_test";
  do {
    pfStack_13a8 = (fdb_kvs_handle *)0x10e7e0;
    fVar3 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(auStack_1370 + (long)handle_00 * 8 + 0x20),
                       logCallbackFunc,"compact_upto_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eb2a;
    handle_00 = (fdb_kvs_handle *)&(handle_00->kvs_config).field_0x1;
  } while ((fdb_kvs_handle *)pcVar14 != handle_00);
  pfStack_13a8 = (fdb_kvs_handle *)0x10e804;
  fVar3 = fdb_get_all_snap_markers
                    (pfStack_1388,(fdb_snapshot_info_t **)&aStack_1390.seqtree,
                     (uint64_t *)&pfStack_1380);
  pcVar29 = pcVar28;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eb2f;
  if ((char)iStack_1374 == '\0') {
    if (pfStack_1380 != (fdb_kvs_handle *)0x4) {
      pfStack_13a8 = (fdb_kvs_handle *)0x10e92b;
      compact_upto_test();
    }
    handle_00 = (fdb_kvs_handle *)0x1400000000;
    doc._M_i = 0;
    pfVar10 = (fdb_kvs_handle *)0xfffffffb00000000;
    pcVar14 = auStack_1370 + 0x40;
    pcVar29 = (char *)0x0;
    aVar11 = aStack_1390;
    do {
      if (*(long *)((long)&(aVar11.seqtree)->root_bid + doc._M_i) != 1) {
        pfStack_13a8 = (fdb_kvs_handle *)0x10e98d;
        compact_upto_test();
        aVar11 = aStack_1330;
      }
      if (*(long *)(*(long *)((long)&(aVar11.seqtree)->blk_handle + doc._M_i) + 8) !=
          (long)handle_00 >> 0x20) {
        pfStack_13a8 = (fdb_kvs_handle *)0x10e9a2;
        compact_upto_test();
        aVar11 = aStack_1330;
      }
      pcVar29 = (char *)((long)pcVar29 + 1);
      handle_00 = (fdb_kvs_handle *)(handle_00[-0x2762763].config.encryption_key.bytes + 0x14);
      doc._M_i = doc._M_i + 0x18;
    } while (pcVar29 < pfStack_1380);
    __s_00 = (code *)(auStack_1370 + 0x40);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e9c4;
    sprintf((char *)__s_00,"compact_test_compact%d",1);
    pfStack_13a8 = (fdb_kvs_handle *)0x10e9da;
    fVar3 = fdb_compact_upto(pfStack_1388,(char *)__s_00,
                             (fdb_snapshot_marker_t)(aStack_1390.seqtree)->blk_ops);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_13a8 = (fdb_kvs_handle *)0x10e9fe;
      fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1370._32_8_,
                                (fdb_kvs_handle **)(auStack_1370 + 0x18),
                                (fdb_seqnum_t)(aStack_1390.seqtrie)->btree_blk_ops->blk_alloc_sub);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_13a8 = (fdb_kvs_handle *)0x10ea07;
        compact_upto_test();
        goto LAB_0010ea07;
      }
LAB_0010ea64:
      __s_00 = (code *)(auStack_1370 + 0x40);
      pfStack_13a8 = (fdb_kvs_handle *)0x10ea6e;
      fdb_kvs_close((fdb_kvs_handle *)auStack_1370._24_8_);
      pfStack_13a8 = (fdb_kvs_handle *)0x10ea7d;
      fVar3 = fdb_free_snap_markers
                        ((fdb_snapshot_info_t *)aStack_1390.seqtree,(uint64_t)pfStack_1380);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        pfStack_13a8 = (fdb_kvs_handle *)0x10ea8f;
        fdb_close(pfStack_1388);
        lVar24 = 0;
        do {
          pfStack_13a8 = (fdb_kvs_handle *)0x10ea9e;
          fdb_doc_free(apfStack_11e0[lVar24]);
          lVar24 = lVar24 + 1;
        } while (lVar24 != 0x14);
        pfStack_13a8 = (fdb_kvs_handle *)0x10eaac;
        fdb_shutdown();
        pfStack_13a8 = (fdb_kvs_handle *)0x10eab1;
        memleak_end();
        pcVar14 = "single kv mode:";
        if ((char)iStack_1374 != '\0') {
          pcVar14 = "multiple kv mode:";
        }
        pfStack_13a8 = (fdb_kvs_handle *)0x10eae1;
        sprintf(acStack_12e0,"compact upto marker in file test %s",pcVar14);
        pcVar14 = "%s PASSED\n";
        if (compact_upto_test(bool)::__test_pass != '\0') {
          pcVar14 = "%s FAILED\n";
        }
        pfStack_13a8 = (fdb_kvs_handle *)0x10eb0e;
        fprintf(_stderr,pcVar14,acStack_12e0);
        return;
      }
      goto LAB_0010eb34;
    }
    goto LAB_0010eb39;
  }
  if (pfStack_1380 != (fdb_kvs_handle *)0x8) {
    pfStack_13a8 = (fdb_kvs_handle *)0x10e82c;
    compact_upto_test();
  }
  auStack_1370._8_8_ = ZEXT48(uVar18 + 1);
  doc._M_i = (__int_type_conflict)auStack_1370;
  pcVar29 = (char *)0x0;
  do {
    __s_00 = (code *)((long)pcVar29 * 3);
    aVar11 = aStack_1390;
    if ((fdb_custom_cmp_variable)(&(aStack_1390.seqtree)->root_bid)[(long)pcVar29 * 3] !=
        (fdb_custom_cmp_variable)auStack_1370._8_8_) {
      pfStack_13a8 = (fdb_kvs_handle *)0x10e911;
      compact_upto_test();
      aVar11 = aStack_1330;
    }
    pfVar10 = (fdb_kvs_handle *)((long)pcVar29 * -5 + 0x14);
    pfVar13 = (fdb_kvs_commit_marker_t *)(&(aVar11.seqtree)->blk_handle)[(long)pcVar29 * 3];
    handle_00 = (fdb_kvs_handle *)0x8;
    pcVar28 = (char *)0x0;
    auStack_1370._16_8_ = pcVar29;
    do {
      if (*(fdb_kvs_handle **)(&(handle_00->kvs_config).create_if_missing + (long)pfVar13) !=
          pfVar10) {
        pfStack_13a8 = (fdb_kvs_handle *)0x10e8e2;
        compact_upto_test();
      }
      pfStack_13a8 = (fdb_kvs_handle *)0x10e892;
      sprintf((char *)doc._M_i,"kv%d",(ulong)pcVar28 & 0xffffffff);
      pfVar13 = (fdb_kvs_commit_marker_t *)(&(aStack_1390.seqtree)->blk_handle)[(long)pcVar29 * 3];
      psVar1 = *(short **)((long)&pfVar13[-1].seqnum + (long)handle_00);
      if ((char)psVar1[1] != auStack_1370[2] || *psVar1 != auStack_1370._0_2_) {
        pfStack_13a8 = (fdb_kvs_handle *)0x10eb2a;
        compact_upto_test();
        goto LAB_0010eb2a;
      }
      pcVar28 = pcVar28 + 1;
      handle_00 = (fdb_kvs_handle *)&(handle_00->kvs_config).custom_cmp_param;
    } while (pcVar14 != pcVar28);
    pcVar29 = (char *)(auStack_1370._16_8_ + 1);
  } while (pcVar29 != pcVar14);
LAB_0010ea07:
  __s_00 = (code *)(auStack_1370 + 0x40);
  pfStack_13a8 = (fdb_kvs_handle *)0x10ea22;
  sprintf((char *)__s_00,"compact_test_compact%d",1);
  pfStack_13a8 = (fdb_kvs_handle *)0x10ea38;
  fVar3 = fdb_compact_upto(pfStack_1388,(char *)__s_00,
                           (fdb_snapshot_marker_t)(aStack_1390.seqtree)->blk_ops);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010eb3e;
  pfStack_13a8 = (fdb_kvs_handle *)0x10ea5c;
  fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1370._40_8_,
                            (fdb_kvs_handle **)(auStack_1370 + 0x18),
                            (fdb_seqnum_t)(aStack_1390.seqtrie)->btree_blk_ops->blk_read);
  if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0010ea64;
LAB_0010eb43:
  pfStack_13a8 = (fdb_kvs_handle *)auto_recover_compact_ok_test;
  compact_upto_test();
  pfStack_1890 = (fdb_kvs_handle *)0x10eb65;
  pcStack_13d0 = __s_00;
  pfStack_13c8 = handle_00;
  pfStack_13c0 = (fdb_kvs_handle *)doc._M_i;
  pcStack_13b8 = pcVar14;
  pcStack_13b0 = pcVar29;
  pfStack_13a8 = pfVar10;
  gettimeofday((timeval *)(auStack_1840 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_1890 = (fdb_kvs_handle *)0x10eb6a;
  memleak_start();
  pfStack_1890 = (fdb_kvs_handle *)0x10eb76;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_1890 = (fdb_kvs_handle *)0x10eb86;
  fdb_get_default_config();
  pfVar12 = (fdb_kvs_handle *)auStack_1840;
  pfStack_1890 = (fdb_kvs_handle *)0x10eb93;
  fdb_get_default_kvs_config();
  fStack_17d0.buffercache_size = 0x1000000;
  fStack_17d0.wal_threshold = 0x400;
  fStack_17d0.flags = 1;
  fStack_17d0.compaction_threshold = '\0';
  ptr_fhandle_00 = (btree *)&pfStack_1870;
  pfStack_1890 = (fdb_kvs_handle *)0x10ebc5;
  fdb_open((fdb_file_handle **)ptr_fhandle_00,"./compact_test1",&fStack_17d0);
  ppfVar16 = &pfStack_1880;
  pfStack_1890 = (fdb_kvs_handle *)0x10ebd8;
  fdb_kvs_open_default(pfStack_1870,ppfVar16,(fdb_kvs_config *)pfVar12);
  pfStack_1890 = (fdb_kvs_handle *)0x10ebee;
  fVar3 = fdb_set_log_callback(pfStack_1880,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_1890 = (fdb_kvs_handle *)0x10ec12;
    fdb_open((fdb_file_handle **)auStack_1860,"./compact_test1",&fStack_17d0);
    ppfVar16 = &pfStack_1868;
    pfStack_1890 = (fdb_kvs_handle *)0x10ec27;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_1860._0_8_,ppfVar16,(fdb_kvs_config *)auStack_1840);
    pfStack_1890 = (fdb_kvs_handle *)0x10ec3d;
    fVar3 = fdb_set_log_callback(pfStack_1868,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f07d;
    pfStack_1890 = (fdb_kvs_handle *)0x10ec60;
    sprintf(acStack_14d8,"key%d",0);
    pfStack_1890 = (fdb_kvs_handle *)0x10ec7b;
    sprintf(acStack_15d8,"meta%d",0);
    ptr_fhandle_00 = abStack_16d8;
    pfStack_1890 = (fdb_kvs_handle *)0x10ec96;
    sprintf((char *)ptr_fhandle_00,"body%d",0);
    pfStack_1890 = (fdb_kvs_handle *)0x10ec9e;
    sVar5 = strlen(acStack_14d8);
    pfStack_1890 = (fdb_kvs_handle *)0x10eca9;
    sVar6 = strlen(acStack_15d8);
    pfStack_1890 = (fdb_kvs_handle *)0x10ecb4;
    sVar7 = strlen((char *)ptr_fhandle_00);
    pfStack_1890 = (fdb_kvs_handle *)0x10ecd4;
    fdb_doc_create((fdb_doc **)(auStack_1860 + 8),acStack_14d8,sVar5,acStack_15d8,sVar6,
                   ptr_fhandle_00,sVar7);
    pfStack_1890 = (fdb_kvs_handle *)0x10ece2;
    fdb_set(pfStack_1880,(fdb_doc *)auStack_1860._8_8_);
    pfStack_1890 = (fdb_kvs_handle *)0x10ecf8;
    sprintf(acStack_14d8,"key%d",1);
    pfStack_1890 = (fdb_kvs_handle *)0x10ed0e;
    sprintf(acStack_15d8,"meta%d",1);
    pfStack_1890 = (fdb_kvs_handle *)0x10ed24;
    sprintf((char *)ptr_fhandle_00,"body%d",1);
    pfStack_1890 = (fdb_kvs_handle *)0x10ed2c;
    sVar5 = strlen(acStack_14d8);
    pfStack_1890 = (fdb_kvs_handle *)0x10ed37;
    sVar6 = strlen(acStack_15d8);
    pfStack_1890 = (fdb_kvs_handle *)0x10ed42;
    sVar7 = strlen((char *)ptr_fhandle_00);
    pfStack_1890 = (fdb_kvs_handle *)0x10ed5f;
    fdb_doc_create((fdb_doc **)(auStack_1860 + 0x10),acStack_14d8,sVar5,acStack_15d8,sVar6,
                   ptr_fhandle_00,sVar7);
    pfStack_1890 = (fdb_kvs_handle *)0x10ed6e;
    fdb_set(pfStack_1880,(fdb_doc *)auStack_1860._16_8_);
    pfStack_1890 = (fdb_kvs_handle *)0x10ed9a;
    fdb_doc_create((fdb_doc **)&pfStack_1878,
                   *(_func_size_t_bnode_ptr_void_ptr_void_ptr_void_ptr_size_t **)
                    (auStack_1860._16_8_ + 0x20),
                   (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)auStack_1860._16_8_,
                   *(btree_print_func **)(auStack_1860._16_8_ + 0x38),
                   (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)
                            (auStack_1860._16_8_ + 8),(void *)0x0,0);
    *(bool *)&pfStack_1878->file = true;
    pfStack_1890 = (fdb_kvs_handle *)0x10edac;
    fdb_set(pfStack_1880,(fdb_doc *)pfStack_1878);
    pfStack_1890 = (fdb_kvs_handle *)0x10edb5;
    fdb_doc_free((fdb_doc *)pfStack_1878);
    pfStack_1890 = (fdb_kvs_handle *)0x10edc4;
    fdb_commit(pfStack_1870,'\x01');
    pfStack_1890 = (fdb_kvs_handle *)0x10edd5;
    fdb_compact(pfStack_1870,"./compact_test2");
    pfStack_1890 = (fdb_kvs_handle *)0x10ede1;
    system("cp  compact_test1 compact_test11 > errorlog.txt");
    pfStack_1890 = (fdb_kvs_handle *)0x10edf7;
    sprintf(acStack_14d8,"key%d",2);
    pfStack_1890 = (fdb_kvs_handle *)0x10ee0d;
    sprintf(acStack_15d8,"meta%d",2);
    pfStack_1890 = (fdb_kvs_handle *)0x10ee23;
    sprintf((char *)ptr_fhandle_00,"body%d",2);
    handle_00 = (fdb_kvs_handle *)(auStack_1860 + 0x18);
    pfStack_1890 = (fdb_kvs_handle *)0x10ee30;
    doc._M_i = strlen(acStack_14d8);
    pfStack_1890 = (fdb_kvs_handle *)0x10ee3b;
    pfVar10 = (fdb_kvs_handle *)strlen(acStack_15d8);
    pfStack_1890 = (fdb_kvs_handle *)0x10ee46;
    sVar5 = strlen((char *)ptr_fhandle_00);
    pfStack_1890 = (fdb_kvs_handle *)0x10ee61;
    fdb_doc_create((fdb_doc **)handle_00,acStack_14d8,doc._M_i,acStack_15d8,(size_t)pfVar10,
                   ptr_fhandle_00,sVar5);
    pfStack_1890 = (fdb_kvs_handle *)0x10ee6f;
    fdb_set(pfStack_1880,(fdb_doc *)auStack_1860._24_8_);
    pfStack_1890 = (fdb_kvs_handle *)0x10ee7e;
    fdb_commit(pfStack_1870,'\x01');
    pfStack_1890 = (fdb_kvs_handle *)0x10ee88;
    fdb_kvs_close(pfStack_1880);
    ppfVar16 = &pfStack_1868;
    pfStack_1890 = (fdb_kvs_handle *)0x10ee95;
    fdb_kvs_close(pfStack_1868);
    pfStack_1890 = (fdb_kvs_handle *)0x10ee9f;
    fdb_close(pfStack_1870);
    pfVar12 = (fdb_kvs_handle *)auStack_1860;
    pfStack_1890 = (fdb_kvs_handle *)0x10eeac;
    fdb_close((fdb_file_handle *)auStack_1860._0_8_);
    pfStack_1890 = (fdb_kvs_handle *)0x10eeb8;
    system("mv  compact_test11 compact_test1 > errorlog.txt");
    pfStack_1890 = (fdb_kvs_handle *)0x10eecf;
    fdb_open((fdb_file_handle **)pfVar12,"./compact_test1",&fStack_17d0);
    pfStack_1890 = (fdb_kvs_handle *)0x10eedf;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_1860._0_8_,ppfVar16,(fdb_kvs_config *)auStack_1840);
    pfStack_1890 = (fdb_kvs_handle *)0x10eef5;
    fVar3 = fdb_set_log_callback(pfStack_1868,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      doc._M_i = 0;
      ppfVar16 = &pfStack_1878;
      while( true ) {
        pfStack_1890 = (fdb_kvs_handle *)0x10ef29;
        fdb_doc_create((fdb_doc **)ppfVar16,
                       (void *)(*(size_t **)(auStack_1860 + doc._M_i * 8 + 8))[4],
                       **(size_t **)(auStack_1860 + doc._M_i * 8 + 8),(void *)0x0,0,(void *)0x0,0);
        pfStack_1890 = (fdb_kvs_handle *)0x10ef38;
        fVar3 = fdb_get(pfStack_1868,(fdb_doc *)pfStack_1878);
        pfVar21 = pfStack_1878;
        if ((fdb_kvs_handle *)doc._M_i != (fdb_kvs_handle *)0x1) break;
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010f073;
LAB_0010ef9e:
        pfStack_1890 = (fdb_kvs_handle *)0x10efa6;
        fdb_doc_free((fdb_doc *)pfVar21);
        doc._M_i = (__int_type_conflict)&(((fdb_kvs_handle *)doc._M_i)->kvs_config).field_0x1;
        pfVar12 = pfVar21;
        if ((undefined1 *)doc._M_i == (undefined1 *)0x3) {
          pfStack_1890 = (fdb_kvs_handle *)0x10efc5;
          fdb_get_file_info((fdb_file_handle *)auStack_1860._0_8_,&fStack_1818);
          pfStack_1890 = (fdb_kvs_handle *)0x10efd4;
          iVar4 = strcmp("./compact_test2",fStack_1818.filename);
          if (iVar4 != 0) {
            pfStack_1890 = (fdb_kvs_handle *)0x10efe2;
            auto_recover_compact_ok_test();
          }
          pfStack_1890 = (fdb_kvs_handle *)0x10efec;
          fdb_kvs_close(pfStack_1868);
          pfStack_1890 = (fdb_kvs_handle *)0x10eff6;
          fdb_close((fdb_file_handle *)auStack_1860._0_8_);
          lVar24 = 0;
          do {
            pfStack_1890 = (fdb_kvs_handle *)0x10f002;
            fdb_doc_free(*(fdb_doc **)(auStack_1860 + lVar24 * 8 + 8));
            lVar24 = lVar24 + 1;
          } while (lVar24 != 3);
          pfStack_1890 = (fdb_kvs_handle *)0x10f010;
          fdb_shutdown();
          pfStack_1890 = (fdb_kvs_handle *)0x10f015;
          memleak_end();
          pcVar14 = "%s PASSED\n";
          if (auto_recover_compact_ok_test()::__test_pass != '\0') {
            pcVar14 = "%s FAILED\n";
          }
          pfStack_1890 = (fdb_kvs_handle *)0x10f046;
          fprintf(_stderr,pcVar14,"auto recovery after compaction test");
          return;
        }
      }
      if (fVar3 == FDB_RESULT_SUCCESS) {
        ptr_fhandle_00 = pfStack_1878->staletree;
        pfVar10 = *(fdb_kvs_handle **)(auStack_1860 + doc._M_i * 8 + 8);
        handle_00 = (fdb_kvs_handle *)pfVar10->staletree;
        pfStack_1890 = (fdb_kvs_handle *)0x10ef77;
        iVar4 = bcmp(ptr_fhandle_00,handle_00,(size_t)(pfStack_1878->kvs_config).custom_cmp);
        if (iVar4 == 0) {
          ptr_fhandle_00 = (pfVar21->field_6).seqtree;
          handle_00 = (fdb_kvs_handle *)(pfVar10->field_6).seqtree;
          pfStack_1890 = (fdb_kvs_handle *)0x10ef96;
          iVar4 = bcmp(ptr_fhandle_00,handle_00,(size_t)(pfVar21->kvs_config).custom_cmp_param);
          if (iVar4 == 0) goto LAB_0010ef9e;
          pfStack_1890 = (fdb_kvs_handle *)0x10f063;
          auto_recover_compact_ok_test();
          pfVar12 = pfVar21;
          goto LAB_0010f063;
        }
      }
      else {
LAB_0010f063:
        pfVar21 = pfVar12;
        pfStack_1890 = (fdb_kvs_handle *)0x10f068;
        auto_recover_compact_ok_test();
      }
      pfStack_1890 = (fdb_kvs_handle *)0x10f073;
      auto_recover_compact_ok_test();
      pfVar12 = pfVar21;
LAB_0010f073:
      pfStack_1890 = (fdb_kvs_handle *)0x10f078;
      auto_recover_compact_ok_test();
      goto LAB_0010f078;
    }
  }
  else {
LAB_0010f078:
    pfStack_1890 = (fdb_kvs_handle *)0x10f07d;
    auto_recover_compact_ok_test();
LAB_0010f07d:
    pfStack_1890 = (fdb_kvs_handle *)0x10f082;
    auto_recover_compact_ok_test();
  }
  pfStack_1890 = (fdb_kvs_handle *)unlink_after_compaction_test;
  auto_recover_compact_ok_test();
  pfStack_1df8 = (fdb_kvs_handle *)0x10f0a7;
  ppfStack_18b8 = ppfVar16;
  pfStack_18b0 = handle_00;
  pfStack_18a8 = (fdb_kvs_handle *)doc._M_i;
  pfStack_18a0 = pfVar12;
  pbStack_1898 = ptr_fhandle_00;
  pfStack_1890 = pfVar10;
  gettimeofday(&tStack_1d68,(__timezone_ptr_t)0x0);
  pfStack_1df8 = (fdb_kvs_handle *)0x10f0ac;
  memleak_start();
  pfStack_1df8 = (fdb_kvs_handle *)0x10f0b8;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_1df8 = (fdb_kvs_handle *)0x10f0c8;
  fdb_get_default_config();
  pfVar12 = (fdb_kvs_handle *)auStack_1d58;
  pfStack_1df8 = (fdb_kvs_handle *)0x10f0d8;
  fdb_get_default_kvs_config();
  fStack_19b0.buffercache_size = 0x1000000;
  fStack_19b0.wal_threshold = 0x400;
  fStack_19b0.flags = 1;
  fStack_19b0.compaction_threshold = '\0';
  ppfVar30 = &pfStack_1dd0;
  pfStack_1df8 = (fdb_kvs_handle *)0x10f10a;
  fdb_open((fdb_file_handle **)ppfVar30,"./compact_test1",&fStack_19b0);
  ptr_handle = (list *)(auStack_1de0 + 8);
  pfStack_1df8 = (fdb_kvs_handle *)0x10f11d;
  fdb_kvs_open_default
            ((fdb_file_handle *)pfStack_1dd0,(fdb_kvs_handle **)ptr_handle,(fdb_kvs_config *)pfVar12
            );
  pfStack_1df8 = (fdb_kvs_handle *)0x10f133;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1de0._8_8_,logCallbackFunc,
                     "unlink_after_compaction_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    handle_00 = (fdb_kvs_handle *)0x0;
    uVar22 = 0;
    do {
      pfStack_1df8 = (fdb_kvs_handle *)0x10f15b;
      sprintf(acStack_1b40,"key%d",uVar22 & 0xffffffff);
      pfStack_1df8 = (fdb_kvs_handle *)0x10f173;
      sprintf(auStack_1d58 + 0x118,"meta%d",uVar22 & 0xffffffff);
      pfStack_1df8 = (fdb_kvs_handle *)0x10f18b;
      sprintf(auStack_1d58 + 0x18,"body%d",uVar22 & 0xffffffff);
      ppfVar30 = (fdb_doc **)((long)apfStack_1dc0 + (long)handle_00);
      pfStack_1df8 = (fdb_kvs_handle *)0x10f19b;
      doc._M_i = strlen(acStack_1b40);
      pfVar10 = (fdb_kvs_handle *)(auStack_1d58 + 0x118);
      pfStack_1df8 = (fdb_kvs_handle *)0x10f1ae;
      pfVar12 = (fdb_kvs_handle *)strlen((char *)pfVar10);
      pfStack_1df8 = (fdb_kvs_handle *)0x10f1be;
      sVar5 = strlen(auStack_1d58 + 0x18);
      pfStack_1df8 = (fdb_kvs_handle *)0x10f1e3;
      fdb_doc_create(ppfVar30,acStack_1b40,doc._M_i,pfVar10,(size_t)pfVar12,auStack_1d58 + 0x18,
                     sVar5);
      pfStack_1df8 = (fdb_kvs_handle *)0x10f1f2;
      fdb_set((fdb_kvs_handle *)auStack_1de0._8_8_,apfStack_1dc0[uVar22]);
      uVar22 = uVar22 + 1;
      handle_00 = (fdb_kvs_handle *)((long)handle_00 + 8);
    } while (uVar22 != 10);
    pfStack_1df8 = (fdb_kvs_handle *)0x10f212;
    fdb_commit((fdb_file_handle *)pfStack_1dd0,'\x01');
    pfStack_1df8 = (fdb_kvs_handle *)0x10f226;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1de0._8_8_,&pfStack_1dc8,10);
    ptr_handle = (list *)0xa;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f38b;
    pfStack_1df8 = (fdb_kvs_handle *)0x10f23f;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_1dd0,"./compact_test2");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfVar12 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_1df8 = (fdb_kvs_handle *)0x10f273;
        fdb_doc_create((fdb_doc **)auStack_1de0,apfStack_1dc0[(long)pfVar12]->key,
                       apfStack_1dc0[(long)pfVar12]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_1df8 = (fdb_kvs_handle *)0x10f282;
        fVar3 = fdb_get((fdb_kvs_handle *)auStack_1de0._8_8_,(fdb_doc *)auStack_1de0._0_8_);
        if (fVar3 != FDB_RESULT_SUCCESS) {
          pfStack_1df8 = (fdb_kvs_handle *)0x10f381;
          unlink_after_compaction_test();
          goto LAB_0010f381;
        }
        pfStack_1df8 = (fdb_kvs_handle *)0x10f294;
        fdb_doc_free((fdb_doc *)auStack_1de0._0_8_);
        pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).field_0x1;
      } while (pfVar12 != (fdb_kvs_handle *)0xa);
      pfStack_1df8 = (fdb_kvs_handle *)0x10f2b1;
      iVar4 = stat("./compact_test1",&sStack_1a40);
      if (iVar4 == 0) {
        pfStack_1df8 = (fdb_kvs_handle *)0x10f2ba;
        unlink_after_compaction_test();
      }
      pfVar12 = (fdb_kvs_handle *)0x0;
      while( true ) {
        pfStack_1df8 = (fdb_kvs_handle *)0x10f2e6;
        fdb_doc_create((fdb_doc **)auStack_1de0,apfStack_1dc0[(long)pfVar12]->key,
                       apfStack_1dc0[(long)pfVar12]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_1df8 = (fdb_kvs_handle *)0x10f2f5;
        fVar3 = fdb_get(pfStack_1dc8,(fdb_doc *)auStack_1de0._0_8_);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        pfStack_1df8 = (fdb_kvs_handle *)0x10f307;
        fdb_doc_free((fdb_doc *)auStack_1de0._0_8_);
        pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).field_0x1;
        if (pfVar12 == (fdb_kvs_handle *)0xa) {
          pfStack_1df8 = (fdb_kvs_handle *)0x10f31a;
          fdb_close((fdb_file_handle *)pfStack_1dd0);
          pfStack_1df8 = (fdb_kvs_handle *)0x10f31f;
          fdb_shutdown();
          lVar24 = 0;
          do {
            pfStack_1df8 = (fdb_kvs_handle *)0x10f32b;
            fdb_doc_free(apfStack_1dc0[lVar24]);
            lVar24 = lVar24 + 1;
          } while (lVar24 != 10);
          pfStack_1df8 = (fdb_kvs_handle *)0x10f339;
          memleak_end();
          pcVar14 = "%s PASSED\n";
          if (unlink_after_compaction_test()::__test_pass != '\0') {
            pcVar14 = "%s FAILED\n";
          }
          pfStack_1df8 = (fdb_kvs_handle *)0x10f36a;
          fprintf(_stderr,pcVar14,"unlink after compaction test");
          return;
        }
      }
LAB_0010f381:
      ptr_handle = (list *)auStack_1de0;
      pfStack_1df8 = (fdb_kvs_handle *)0x10f386;
      unlink_after_compaction_test();
      goto LAB_0010f386;
    }
  }
  else {
LAB_0010f386:
    pfStack_1df8 = (fdb_kvs_handle *)0x10f38b;
    unlink_after_compaction_test();
LAB_0010f38b:
    pfStack_1df8 = (fdb_kvs_handle *)0x10f390;
    unlink_after_compaction_test();
  }
  pfStack_1df8 = (fdb_kvs_handle *)db_compact_overwrite;
  unlink_after_compaction_test();
  pfStack_25a0 = (fdb_kvs_handle *)0x10f3b5;
  fStack_2008.bub_ctx.entries = ptr_handle;
  fStack_2008.bub_ctx.num_entries = (uint64_t)handle_00;
  fStack_2008.bub_ctx.space_used = doc._M_i;
  fStack_2008.bub_ctx.handle = pfVar12;
  ppfStack_1e00 = ppfVar30;
  pfStack_1df8 = pfVar10;
  gettimeofday(&tStack_2508,(__timezone_ptr_t)0x0);
  pfStack_25a0 = (fdb_kvs_handle *)0x10f3ba;
  memleak_start();
  pfStack_25a0 = (fdb_kvs_handle *)0x10f3c6;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_25a0 = (fdb_kvs_handle *)0x10f3d6;
  fdb_get_default_config();
  kvs_config_00 = &fStack_2550;
  pfStack_25a0 = (fdb_kvs_handle *)0x10f3e3;
  fdb_get_default_kvs_config();
  auStack_23f8._256_8_ = 0x1000000;
  auStack_23f8._264_8_ = 0x400;
  auStack_23f8._284_4_ = 1;
  auStack_23f8[0x127] = 0;
  pfVar12 = (fdb_kvs_handle *)(auStack_2578 + 0x18);
  pfStack_25a0 = (fdb_kvs_handle *)0x10f415;
  fdb_open((fdb_file_handle **)pfVar12,"./compact_test1",(fdb_config *)(auStack_23f8 + 0xf8));
  ppfVar16 = (fdb_kvs_handle **)(auStack_2578 + 8);
  pfStack_25a0 = (fdb_kvs_handle *)0x10f42a;
  fdb_kvs_open((fdb_file_handle *)auStack_2578._24_8_,ppfVar16,(char *)0x0,kvs_config_00);
  pfStack_25a0 = (fdb_kvs_handle *)0x10f440;
  pfVar21 = (fdb_kvs_handle *)auStack_2578._8_8_;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_2578._8_8_,logCallbackFunc,"db_destroy_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    handle_00 = (fdb_kvs_handle *)0x0;
    uVar22 = 0;
    do {
      pfStack_25a0 = (fdb_kvs_handle *)0x10f468;
      sprintf(acStack_2108,"key%d",uVar22 & 0xffffffff);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f480;
      sprintf(auStack_23f8 + 0x1f0,"meta%d",uVar22 & 0xffffffff);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f498;
      sprintf(acStack_24f8,"body%d",uVar22 & 0xffffffff);
      pfVar12 = (fdb_kvs_handle *)(auStack_23f8 + (long)handle_00);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f4ab;
      doc._M_i = strlen(acStack_2108);
      pfVar10 = (fdb_kvs_handle *)(auStack_23f8 + 0x1f0);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f4be;
      kvs_config_00 = (fdb_kvs_config *)strlen((char *)pfVar10);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f4ce;
      sVar5 = strlen(acStack_24f8);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f4f3;
      fdb_doc_create((fdb_doc **)pfVar12,acStack_2108,doc._M_i,pfVar10,(size_t)kvs_config_00,
                     acStack_24f8,sVar5);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f505;
      fdb_set((fdb_kvs_handle *)auStack_2578._8_8_,*(fdb_doc **)(auStack_23f8 + uVar22 * 8));
      uVar22 = uVar22 + 1;
      handle_00 = (fdb_kvs_handle *)((long)handle_00 + 8);
    } while (uVar22 != 0x1e);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f522;
    fdb_commit((fdb_file_handle *)auStack_2578._24_8_,'\0');
    pfStack_25a0 = (fdb_kvs_handle *)0x10f53e;
    fdb_open((fdb_file_handle **)(auStack_2578 + 0x10),"./compact_test1.1",
             (fdb_config *)(auStack_23f8 + 0xf8));
    ppfVar16 = (fdb_kvs_handle **)auStack_2588;
    pfStack_25a0 = (fdb_kvs_handle *)0x10f555;
    fdb_kvs_open((fdb_file_handle *)auStack_2578._16_8_,ppfVar16,(char *)0x0,&fStack_2550);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f56b;
    pfVar21 = (fdb_kvs_handle *)auStack_2588._0_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_2588._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f9da;
    handle_00 = (fdb_kvs_handle *)0x0;
    uVar22 = 0;
    do {
      pfStack_25a0 = (fdb_kvs_handle *)0x10f593;
      sprintf(acStack_2108,"k2ey%d",uVar22 & 0xffffffff);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f5ab;
      sprintf(auStack_23f8 + 0x1f0,"m2eta%d",uVar22 & 0xffffffff);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f5c3;
      sprintf(acStack_24f8,"b2ody%d",uVar22 & 0xffffffff);
      pfVar12 = (fdb_kvs_handle *)(&fStack_2008.kvs_config.create_if_missing + (long)handle_00);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f5d6;
      doc._M_i = strlen(acStack_2108);
      pfVar10 = (fdb_kvs_handle *)(auStack_23f8 + 0x1f0);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f5e9;
      kvs_config_00 = (fdb_kvs_config *)strlen((char *)pfVar10);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f5f9;
      sVar5 = strlen(acStack_24f8);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f61e;
      fdb_doc_create((fdb_doc **)pfVar12,acStack_2108,doc._M_i,pfVar10,(size_t)kvs_config_00,
                     acStack_24f8,sVar5);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f630;
      fdb_set((fdb_kvs_handle *)auStack_2588._0_8_,
              *(fdb_doc **)(&fStack_2008.kvs_config.create_if_missing + uVar22 * 8));
      uVar22 = uVar22 + 1;
      handle_00 = (fdb_kvs_handle *)((long)handle_00 + 8);
    } while (uVar22 != 0x3c);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f64d;
    fdb_commit((fdb_file_handle *)auStack_2578._16_8_,'\0');
    pfStack_25a0 = (fdb_kvs_handle *)0x10f65c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_2588._0_8_,&fStack_2538);
    if ((filemgr *)fStack_2538.last_seqnum != (filemgr *)0x3c) {
      pfStack_25a0 = (fdb_kvs_handle *)0x10f66c;
      db_compact_overwrite();
    }
    pfStack_25a0 = (fdb_kvs_handle *)0x10f676;
    fdb_kvs_close((fdb_kvs_handle *)auStack_2588._0_8_);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f680;
    fdb_close((fdb_file_handle *)auStack_2578._16_8_);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f68c;
    pfVar21 = (fdb_kvs_handle *)auStack_2578._24_8_;
    fVar3 = fdb_compact((fdb_file_handle *)auStack_2578._24_8_,(char *)0x0);
    ppfVar16 = (fdb_kvs_handle **)0x3c;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f9df;
    kvs_config_00 = (fdb_kvs_config *)(auStack_2578 + 8);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f6a1;
    fdb_kvs_close((fdb_kvs_handle *)auStack_2578._8_8_);
    pfVar12 = (fdb_kvs_handle *)(auStack_2578 + 0x18);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f6ae;
    fdb_close((fdb_file_handle *)auStack_2578._24_8_);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f6c5;
    fdb_open((fdb_file_handle **)pfVar12,"./compact_test1",(fdb_config *)(auStack_23f8 + 0xf8));
    pfStack_25a0 = (fdb_kvs_handle *)0x10f6d7;
    fdb_kvs_open((fdb_file_handle *)auStack_2578._24_8_,(fdb_kvs_handle **)kvs_config_00,(char *)0x0
                 ,&fStack_2550);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f6ed;
    pfVar21 = (fdb_kvs_handle *)auStack_2578._8_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_2578._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010f9e4;
    ppfVar16 = (fdb_kvs_handle **)0x0;
    kvs_config_00 = (fdb_kvs_config *)(auStack_2588 + 8);
    pfVar12 = (fdb_kvs_handle *)auStack_2578;
    do {
      pfStack_25a0 = (fdb_kvs_handle *)0x10f728;
      fdb_doc_create((fdb_doc **)kvs_config_00,
                     (void *)(*(size_t **)(auStack_23f8 + (long)ppfVar16))[4],
                     **(size_t **)(auStack_23f8 + (long)ppfVar16),(void *)0x0,0,(void *)0x0,0);
      pfStack_25a0 = (fdb_kvs_handle *)0x10f737;
      pfVar21 = (fdb_kvs_handle *)auStack_2578._8_8_;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_2578._8_8_,(fdb_doc *)auStack_2588._8_8_);
      pfVar19 = (fdb_kvs_handle *)auStack_2588._8_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_25a0 = (fdb_kvs_handle *)0x10f9d0;
        db_compact_overwrite();
        goto LAB_0010f9d0;
      }
      doc._M_i = (__int_type_conflict)(auStack_23f8 + (long)ppfVar16);
      handle_00 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)doc._M_i)->kvs_config;
      pfStack_25a0 = (fdb_kvs_handle *)0x10f765;
      iVar4 = bcmp(*(btree **)(auStack_2588._8_8_ + 0x38),handle_00->staletree,
                   (size_t)((fdb_kvs_config *)auStack_2588._8_8_)->custom_cmp);
      if (iVar4 != 0) {
        pfStack_25a0 = (fdb_kvs_handle *)0x10f7ad;
        db_compact_overwrite();
        pfVar19 = pfStack_2558;
        handle_00 = (fdb_kvs_handle *)auStack_2578._0_8_;
      }
      pfStack_25a0 = (fdb_kvs_handle *)0x10f77b;
      iVar4 = bcmp((pfVar19->field_6).seqtree,(handle_00->field_6).seqtree,
                   (size_t)(pfVar19->kvs_config).custom_cmp_param);
      pfVar10 = pfVar19;
      if (iVar4 != 0) {
        pfStack_25a0 = (fdb_kvs_handle *)0x10f7c7;
        db_compact_overwrite();
        pfVar10 = (fdb_kvs_handle *)auStack_2578._0_8_;
      }
      pfStack_25a0 = (fdb_kvs_handle *)0x10f787;
      fdb_doc_free((fdb_doc *)pfVar10);
      ppfVar16 = ppfVar16 + 1;
    } while (ppfVar16 != (fdb_kvs_handle **)0xf0);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f7ea;
    fdb_open((fdb_file_handle **)(auStack_2578 + 0x10),"./compact_test1.1",
             (fdb_config *)(auStack_23f8 + 0xf8));
    kvs_config_00 = (fdb_kvs_config *)auStack_2588;
    pfStack_25a0 = (fdb_kvs_handle *)0x10f801;
    fdb_kvs_open((fdb_file_handle *)auStack_2578._16_8_,(fdb_kvs_handle **)kvs_config_00,(char *)0x0
                 ,&fStack_2550);
    pfStack_25a0 = (fdb_kvs_handle *)0x10f817;
    pfVar21 = (fdb_kvs_handle *)auStack_2588._0_8_;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_2588._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_25a0 = (fdb_kvs_handle *)0x10f831;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_2588._0_8_,&fStack_2538);
      if ((filemgr *)fStack_2538.last_seqnum != (filemgr *)0x3c) {
        pfStack_25a0 = (fdb_kvs_handle *)0x10f842;
        db_compact_overwrite();
      }
      pfVar10 = (fdb_kvs_handle *)0x0;
      ppfVar16 = (fdb_kvs_handle **)(auStack_2588 + 8);
      kvs_config_00 = (fdb_kvs_config *)auStack_2578;
      while( true ) {
        psVar2 = *(size_t **)
                  (&fStack_2008.kvs_config.create_if_missing +
                  (long)&(pfVar10->kvs_config).create_if_missing);
        pfStack_25a0 = (fdb_kvs_handle *)0x10f875;
        fdb_doc_create((fdb_doc **)ppfVar16,(void *)psVar2[4],*psVar2,(void *)0x0,0,(void *)0x0,0);
        pfStack_25a0 = (fdb_kvs_handle *)0x10f884;
        pfVar21 = (fdb_kvs_handle *)auStack_2588._0_8_;
        fVar3 = fdb_get((fdb_kvs_handle *)auStack_2588._0_8_,(fdb_doc *)auStack_2588._8_8_);
        pfVar19 = (fdb_kvs_handle *)auStack_2588._8_8_;
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        handle_00 = (fdb_kvs_handle *)
                    (&fStack_2008.kvs_config.create_if_missing +
                    (long)&(pfVar10->kvs_config).create_if_missing);
        pfVar12 = *(fdb_kvs_handle **)&handle_00->kvs_config;
        pfStack_25a0 = (fdb_kvs_handle *)0x10f8b1;
        iVar4 = bcmp(*(btree **)(auStack_2588._8_8_ + 0x38),pfVar12->staletree,
                     (size_t)((fdb_kvs_config *)auStack_2588._8_8_)->custom_cmp);
        if (iVar4 != 0) {
          pfStack_25a0 = (fdb_kvs_handle *)0x10f8f8;
          db_compact_overwrite();
          pfVar19 = pfStack_2558;
          pfVar12 = (fdb_kvs_handle *)auStack_2578._0_8_;
        }
        pfStack_25a0 = (fdb_kvs_handle *)0x10f8c6;
        iVar4 = bcmp((pfVar19->field_6).seqtree,(pfVar12->field_6).seqtree,
                     (size_t)(pfVar19->kvs_config).custom_cmp_param);
        doc._M_i = (__int_type_conflict)pfVar19;
        if (iVar4 != 0) {
          pfStack_25a0 = (fdb_kvs_handle *)0x10f912;
          db_compact_overwrite();
          doc._M_i = auStack_2578._0_8_;
        }
        pfStack_25a0 = (fdb_kvs_handle *)0x10f8d2;
        fdb_doc_free((fdb_doc *)doc._M_i);
        pfVar10 = (fdb_kvs_handle *)&(pfVar10->kvs_config).custom_cmp;
        if (pfVar10 == (fdb_kvs_handle *)0x1e0) {
          lVar24 = 0;
          do {
            pfStack_25a0 = (fdb_kvs_handle *)0x10f928;
            fdb_doc_free(*(fdb_doc **)(auStack_23f8 + lVar24 * 8));
            pfStack_25a0 = (fdb_kvs_handle *)0x10f935;
            fdb_doc_free(*(fdb_doc **)(&fStack_2008.kvs_config.create_if_missing + lVar24 * 8));
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0x1e);
          lVar24 = 0;
          do {
            pfStack_25a0 = (fdb_kvs_handle *)0x10f94d;
            fdb_doc_free(*(fdb_doc **)(fStack_2008.config.encryption_key.bytes + lVar24 * 8 + -0x14)
                        );
            lVar24 = lVar24 + 1;
          } while (lVar24 != 0x1e);
          pfStack_25a0 = (fdb_kvs_handle *)0x10f960;
          fdb_kvs_close((fdb_kvs_handle *)auStack_2578._8_8_);
          pfStack_25a0 = (fdb_kvs_handle *)0x10f96a;
          fdb_close((fdb_file_handle *)auStack_2578._24_8_);
          pfStack_25a0 = (fdb_kvs_handle *)0x10f974;
          fdb_kvs_close((fdb_kvs_handle *)auStack_2588._0_8_);
          pfStack_25a0 = (fdb_kvs_handle *)0x10f97e;
          fdb_close((fdb_file_handle *)auStack_2578._16_8_);
          pfStack_25a0 = (fdb_kvs_handle *)0x10f983;
          fdb_shutdown();
          pfStack_25a0 = (fdb_kvs_handle *)0x10f988;
          memleak_end();
          pcVar14 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar14 = "%s FAILED\n";
          }
          pfStack_25a0 = (fdb_kvs_handle *)0x10f9b9;
          fprintf(_stderr,pcVar14,"compact overwrite");
          return;
        }
      }
LAB_0010f9d0:
      pfStack_25a0 = (fdb_kvs_handle *)0x10f9d5;
      db_compact_overwrite();
      goto LAB_0010f9d5;
    }
  }
  else {
LAB_0010f9d5:
    pfStack_25a0 = (fdb_kvs_handle *)0x10f9da;
    db_compact_overwrite();
LAB_0010f9da:
    pfStack_25a0 = (fdb_kvs_handle *)0x10f9df;
    db_compact_overwrite();
LAB_0010f9df:
    pfStack_25a0 = (fdb_kvs_handle *)0x10f9e4;
    db_compact_overwrite();
LAB_0010f9e4:
    pfStack_25a0 = (fdb_kvs_handle *)0x10f9e9;
    db_compact_overwrite();
  }
  pfStack_25a0 = (fdb_kvs_handle *)db_compact_during_doc_delete;
  db_compact_overwrite();
  ppfStack_25c8 = ppfVar16;
  pfStack_25c0 = handle_00;
  pfStack_25b8 = (fdb_kvs_handle *)doc._M_i;
  pfStack_25b0 = kvs_config_00;
  pfStack_25a8 = pfVar12;
  pfStack_25a0 = pfVar10;
  gettimeofday(&tStack_2cf8,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStack_2ce8.buffercache_size = 0;
  fStack_2ce8.wal_threshold = 0x400;
  fStack_2ce8.compaction_threshold = '\0';
  if (pfVar21 == (fdb_kvs_handle *)0x0) {
    system("rm -rf  compact_test* > errorlog.txt");
    _Var23._M_i = (__int_type_conflict)&pfStack_2d60;
    fVar3 = fdb_open((fdb_file_handle **)_Var23._M_i,"./compact_test1",&fStack_2ce8);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      _Var23._M_i = (__int_type_conflict)pfStack_2d60;
      fVar3 = fdb_kvs_open_default((fdb_file_handle *)pfStack_2d60,&pfStack_2d58,&fStack_2d40);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fd42;
      lVar24 = 0;
      uVar22 = 0;
      do {
        __s = &afStack_2af0[0].config.encryption_key;
        sprintf((char *)__s,"key%d",uVar22 & 0xffffffff);
        sprintf((char *)afStack_2af0,"meta%d",uVar22 & 0xffffffff);
        sprintf(acStack_2bf0,"body%d",uVar22 & 0xffffffff);
        doc._M_i = strlen((char *)__s);
        pfVar10 = afStack_2af0;
        sVar5 = strlen((char *)pfVar10);
        sVar6 = strlen(acStack_2bf0);
        fdb_doc_create((fdb_doc **)((long)&afStack_2af0[0].bub_ctx.handle + lVar24),
                       &afStack_2af0[0].config.encryption_key,doc._M_i,pfVar10,sVar5,acStack_2bf0,
                       sVar6);
        fdb_set(pfStack_2d58,(fdb_doc *)(&afStack_2af0[0].bub_ctx.handle)[uVar22]);
        uVar22 = uVar22 + 1;
        lVar24 = lVar24 + 8;
      } while (uVar22 != 100);
      fdb_commit((fdb_file_handle *)pfStack_2d60,'\0');
      fdb_get_kvs_info(pfStack_2d58,&fStack_2d28);
      if ((filemgr *)fStack_2d28.doc_count != (filemgr *)0x64) {
        db_compact_during_doc_delete();
      }
      lVar24 = 0;
      pfVar12 = (fdb_kvs_handle *)&plStack_2d50;
      do {
        fdb_del(pfStack_2d58,(fdb_doc *)(&afStack_2af0[0].bub_ctx.handle)[lVar24]);
        if (lVar24 == 0x32) {
          pthread_create((pthread_t *)pfVar12,(pthread_attr_t *)0x0,db_compact_during_doc_delete,
                         pfStack_2d60);
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 != 100);
      pthread_join((pthread_t)plStack_2d50,&pvStack_2d48);
      fdb_commit((fdb_file_handle *)pfStack_2d60,'\x01');
      fdb_get_kvs_info(pfStack_2d58,&fStack_2d28);
      if ((filemgr *)fStack_2d28.doc_count != (filemgr *)0x0) {
        db_compact_during_doc_delete();
      }
      fdb_kvs_close(pfStack_2d58);
      _Var23._M_i = (__int_type_conflict)&pfStack_2d60;
      fdb_close((fdb_file_handle *)pfStack_2d60);
      fVar3 = fdb_open((fdb_file_handle **)_Var23._M_i,"./compact_test1",&fStack_2ce8);
      handle_00 = (fdb_kvs_handle *)0x64;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fd47;
      _Var23._M_i = (__int_type_conflict)pfStack_2d60;
      fVar3 = fdb_kvs_open_default((fdb_file_handle *)pfStack_2d60,&pfStack_2d58,&fStack_2d40);
      if (fVar3 == FDB_RESULT_SUCCESS) {
        fdb_get_kvs_info(pfStack_2d58,&fStack_2d28);
        if ((filemgr *)fStack_2d28.doc_count != (filemgr *)0x0) {
          db_compact_during_doc_delete();
        }
        lVar24 = 0;
        do {
          fdb_doc_free((fdb_doc *)(&afStack_2af0[0].bub_ctx.handle)[lVar24]);
          lVar24 = lVar24 + 1;
        } while (lVar24 != 100);
        fdb_kvs_close(pfStack_2d58);
        fdb_close((fdb_file_handle *)pfStack_2d60);
        fdb_shutdown();
        memleak_end();
        pcVar14 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar14 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar14,"multi thread client shutdown");
        return;
      }
    }
    else {
      db_compact_during_doc_delete();
LAB_0010fd42:
      db_compact_during_doc_delete();
LAB_0010fd47:
      db_compact_during_doc_delete();
    }
    db_compact_during_doc_delete();
LAB_0010fd51:
    db_compact_during_doc_delete();
  }
  else {
    _Var23._M_i = (__int_type_conflict)&pfStack_2d60;
    fVar3 = fdb_open((fdb_file_handle **)_Var23._M_i,"./compact_test1",&fStack_2ce8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010fd51;
    _Var23._M_i = (__int_type_conflict)pfStack_2d60;
    fVar3 = fdb_compact((fdb_file_handle *)pfStack_2d60,(char *)0x0);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fdb_close((fdb_file_handle *)pfStack_2d60);
      pthread_exit((void *)0x0);
    }
  }
  db_compact_during_doc_delete();
  ptr_fhandle = (filemgr *)0x0;
  pfStack_16b20 = (fdb_kvs_handle *)0x10fd83;
  auStack_16ae8._8_8_ = _Var23._M_i;
  gettimeofday(&tStack_16980,(__timezone_ptr_t)0x0);
  pfStack_16b20 = (fdb_kvs_handle *)0x10fd88;
  memleak_start();
  pfStack_16b20 = (fdb_kvs_handle *)0x10fd94;
  system("rm -rf  compact_test* > errorlog.txt");
  pcVar14 = auStack_16a88;
  pfStack_16b20 = (fdb_kvs_handle *)0x10fda4;
  fdb_get_default_config();
  pfStack_16b20 = (fdb_kvs_handle *)0x10fdae;
  fdb_get_default_kvs_config();
  auStack_16a88._8_8_ = 0;
  aStack_16a78.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x400;
  fStack_16a64 = 1;
  uStack_16a5a = 0x1e01;
  pfStack_16a50 = (filemgr *)0x1;
  aStack_16a10.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  pcVar28 = auStack_16b10;
  pfStack_16b20 = (fdb_kvs_handle *)0x10fde7;
  fVar3 = fdb_open((fdb_file_handle **)pcVar28,"compact_test",(fdb_config *)pcVar14);
  if (fVar3 == FDB_RESULT_INVALID_CONFIG) {
    aStack_16a10.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)4;
    pfStack_16b20 = (fdb_kvs_handle *)0x10fe14;
    fdb_open((fdb_file_handle **)auStack_16b10,"compact_test",(fdb_config *)auStack_16a88);
    pcVar14 = auStack_16b08;
    pfStack_16b20 = (fdb_kvs_handle *)0x10fe29;
    fdb_kvs_open_default((fdb_file_handle *)auStack_16b10,(fdb_kvs_handle **)pcVar14,&fStack_16ad8);
    pfStack_16b20 = (fdb_kvs_handle *)0x10fe3f;
    pcVar28 = (char *)auStack_16b08;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_16b08,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108c8;
    pfStack_16b20 = (fdb_kvs_handle *)0x10fe53;
    puts("Initialize..");
    doc._M_i = 0;
    uVar22 = 0;
    do {
      pfStack_16b20 = (fdb_kvs_handle *)0x10fe75;
      sprintf(auStack_16970 + 0x48,"key%04d",uVar22 & 0xffffffff);
      pfStack_16b20 = (fdb_kvs_handle *)0x10fe8e;
      sprintf(acStack_16728,"meta%04d",uVar22 & 0xffffffff);
      pfStack_16b20 = (fdb_kvs_handle *)0x10fea7;
      sprintf(acStack_16828,"body%04d",uVar22 & 0xffffffff);
      handle_00 = (fdb_kvs_handle *)(&afStack_16628[0].kvs_config.create_if_missing + doc._M_i);
      pfStack_16b20 = (fdb_kvs_handle *)0x10feba;
      sVar5 = strlen(auStack_16970 + 0x48);
      pfVar10 = (fdb_kvs_handle *)(sVar5 + 1);
      pfStack_16b20 = (fdb_kvs_handle *)0x10fece;
      sVar5 = strlen(acStack_16728);
      pfVar12 = (fdb_kvs_handle *)(sVar5 + 1);
      pfStack_16b20 = (fdb_kvs_handle *)0x10fedf;
      sVar5 = strlen(acStack_16828);
      pfStack_16b20 = (fdb_kvs_handle *)0x10ff07;
      fdb_doc_create((fdb_doc **)handle_00,auStack_16970 + 0x48,(size_t)pfVar10,acStack_16728,
                     (size_t)pfVar12,acStack_16828,sVar5 + 1);
      pfStack_16b20 = (fdb_kvs_handle *)0x10ff19;
      fdb_set((fdb_kvs_handle *)auStack_16b08,
              *(fdb_doc **)(&afStack_16628[0].kvs_config.create_if_missing + uVar22 * 8));
      uVar22 = uVar22 + 1;
      doc._M_i = doc._M_i + 8;
    } while (uVar22 != 10000);
    pcVar14 = auStack_16b10;
    pfStack_16b20 = (fdb_kvs_handle *)0x10ff3c;
    fdb_commit((fdb_file_handle *)auStack_16b10,'\0');
    pfStack_16b20 = (fdb_kvs_handle *)0x10ff44;
    fdb_close((fdb_file_handle *)auStack_16b10);
    pfStack_16b20 = (fdb_kvs_handle *)0x10ff5b;
    pcVar28 = pcVar14;
    fVar3 = fdb_open((fdb_file_handle **)pcVar14,"compact_test",(fdb_config *)auStack_16a88);
    ptr_fhandle = (filemgr *)0x2710;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108cd;
    pfStack_16b20 = (fdb_kvs_handle *)0x10ff77;
    pcVar28 = (char *)auStack_16b10;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_16b10,(fdb_kvs_handle **)auStack_16b08,
                       &fStack_16ad8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108d2;
    pfStack_16b20 = (fdb_kvs_handle *)0x10ff97;
    pcVar28 = (char *)auStack_16b08;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_16b08,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108d7;
    pcVar14 = auStack_16970;
    pfStack_16b20 = (fdb_kvs_handle *)0x10ffb4;
    fdb_get_file_info((fdb_file_handle *)auStack_16b10,(fdb_file_info *)pcVar14);
    pfStack_16b20 = (fdb_kvs_handle *)0x10ffc3;
    iVar4 = strcmp((char *)auStack_16970._0_8_,"compact_test");
    if (iVar4 != 0) {
      pfStack_16b20 = (fdb_kvs_handle *)0x10ffd4;
      compaction_daemon_test();
    }
    ptr_fhandle = (filemgr *)(auStack_16970 + 0x48);
    pfVar12 = (fdb_kvs_handle *)auStack_16af8;
    handle_00 = (fdb_kvs_handle *)0x0;
    _Var23._M_i = doc._M_i;
    do {
      pfStack_16b20 = (fdb_kvs_handle *)0x10fff8;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)handle_00 & 0xffffffff);
      pfStack_16b20 = (fdb_kvs_handle *)0x110000;
      sVar5 = strlen((char *)ptr_fhandle);
      pfStack_16b20 = (fdb_kvs_handle *)0x11001f;
      fdb_doc_create((fdb_doc **)pfVar12,ptr_fhandle,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_16b20 = (fdb_kvs_handle *)0x11002e;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_16b08,(fdb_doc *)auStack_16af8._0_8_);
      doc._M_i = auStack_16af8._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_0011089e:
        pfStack_16b20 = (fdb_kvs_handle *)0x1108a3;
        compaction_daemon_test();
        goto LAB_001108a3;
      }
      pfVar10 = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_16af8._0_8_ + 0x40))->
                seqtree;
      pcVar14 = *(char **)(*(long *)(&afStack_16628[0].kvs_config.create_if_missing +
                                    (long)handle_00 * 8) + 0x40);
      pfStack_16b20 = (fdb_kvs_handle *)0x11005a;
      iVar4 = bcmp(pfVar10,pcVar14,(size_t)*(void **)(auStack_16af8._0_8_ + 0x10));
      _Var23._M_i = doc._M_i;
      if (iVar4 != 0) {
        pfStack_16b20 = (fdb_kvs_handle *)0x11089e;
        compaction_daemon_test();
        goto LAB_0011089e;
      }
      pfStack_16b20 = (fdb_kvs_handle *)0x11006a;
      fdb_doc_free((fdb_doc *)doc._M_i);
      handle_00 = (fdb_kvs_handle *)&(handle_00->kvs_config).field_0x1;
    } while (handle_00 != (fdb_kvs_handle *)0x2710);
    pfStack_16b20 = (fdb_kvs_handle *)0x11008e;
    pcVar28 = (char *)auStack_16b08;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_16b08,(fdb_kvs_handle **)&aStack_16ac0,10000
                             );
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108dc;
    pfStack_16b20 = (fdb_kvs_handle *)0x1100a0;
    fdb_kvs_close((fdb_kvs_handle *)aStack_16ac0.super___atomic_base<unsigned_long>._M_i);
    pcVar14 = auStack_16b10;
    pfStack_16b20 = (fdb_kvs_handle *)0x1100ad;
    fdb_close((fdb_file_handle *)auStack_16b10);
    pfStack_16b20 = (fdb_kvs_handle *)0x1100b9;
    system("rm -rf  compact_test.meta > errorlog.txt");
    pfStack_16b20 = (fdb_kvs_handle *)0x1100d0;
    pcVar28 = pcVar14;
    fVar3 = fdb_open((fdb_file_handle **)pcVar14,"compact_test",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108e1;
    pfStack_16b20 = (fdb_kvs_handle *)0x1100ec;
    pcVar28 = (char *)auStack_16b10;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_16b10,(fdb_kvs_handle **)auStack_16b08,
                       &fStack_16ad8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108e6;
    pfStack_16b20 = (fdb_kvs_handle *)0x11010c;
    pcVar28 = (char *)auStack_16b08;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_16b08,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108eb;
    ptr_fhandle = (filemgr *)(auStack_16970 + 0x48);
    pfVar12 = (fdb_kvs_handle *)auStack_16af8;
    handle_00 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_16b20 = (fdb_kvs_handle *)0x110138;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)handle_00 & 0xffffffff);
      pfStack_16b20 = (fdb_kvs_handle *)0x110140;
      sVar5 = strlen((char *)ptr_fhandle);
      pfStack_16b20 = (fdb_kvs_handle *)0x11015f;
      fdb_doc_create((fdb_doc **)pfVar12,ptr_fhandle,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_16b20 = (fdb_kvs_handle *)0x11016e;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_16b08,(fdb_doc *)auStack_16af8._0_8_);
      _Var23._M_i = auStack_16af8._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108ae;
      pfVar10 = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_16af8._0_8_ + 0x40))->
                seqtree;
      pcVar14 = *(char **)(*(long *)(&afStack_16628[0].kvs_config.create_if_missing +
                                    (long)handle_00 * 8) + 0x40);
      pfStack_16b20 = (fdb_kvs_handle *)0x11019a;
      iVar4 = bcmp(pfVar10,pcVar14,(size_t)*(void **)(auStack_16af8._0_8_ + 0x10));
      if (iVar4 != 0) goto LAB_001108a3;
      pfStack_16b20 = (fdb_kvs_handle *)0x1101aa;
      fdb_doc_free((fdb_doc *)_Var23._M_i);
      handle_00 = (fdb_kvs_handle *)&(handle_00->kvs_config).field_0x1;
      doc._M_i = _Var23._M_i;
    } while (handle_00 != (fdb_kvs_handle *)0x2710);
    pcVar14 = auStack_16b10;
    pfStack_16b20 = (fdb_kvs_handle *)0x1101c7;
    fdb_close((fdb_file_handle *)auStack_16b10);
    pfStack_16b20 = (fdb_kvs_handle *)0x1101d3;
    system("mv  compact_test.0 compact_test.23 > errorlog.txt");
    pfStack_16b20 = (fdb_kvs_handle *)0x1101ea;
    pcVar28 = pcVar14;
    fVar3 = fdb_open((fdb_file_handle **)pcVar14,"compact_test",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108f0;
    pfStack_16b20 = (fdb_kvs_handle *)0x110206;
    pcVar28 = (char *)auStack_16b10;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_16b10,(fdb_kvs_handle **)auStack_16b08,
                       &fStack_16ad8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108f5;
    pfStack_16b20 = (fdb_kvs_handle *)0x110226;
    pcVar28 = (char *)auStack_16b08;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_16b08,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108fa;
    ptr_fhandle = (filemgr *)(auStack_16970 + 0x48);
    pfVar12 = (fdb_kvs_handle *)auStack_16af8;
    handle_00 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_16b20 = (fdb_kvs_handle *)0x110252;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)handle_00 & 0xffffffff);
      pfStack_16b20 = (fdb_kvs_handle *)0x11025a;
      sVar5 = strlen((char *)ptr_fhandle);
      pfStack_16b20 = (fdb_kvs_handle *)0x110279;
      fdb_doc_create((fdb_doc **)pfVar12,ptr_fhandle,sVar5 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_16b20 = (fdb_kvs_handle *)0x110288;
      pcVar28 = (char *)auStack_16b08;
      fVar3 = fdb_get((fdb_kvs_handle *)auStack_16b08,(fdb_doc *)auStack_16af8._0_8_);
      _Var23._M_i = auStack_16af8._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108be;
      pfVar10 = (fdb_kvs_handle *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_16af8._0_8_ + 0x40))->
                seqtree;
      pcVar14 = *(char **)(*(long *)(&afStack_16628[0].kvs_config.create_if_missing +
                                    (long)handle_00 * 8) + 0x40);
      pfStack_16b20 = (fdb_kvs_handle *)0x1102b4;
      iVar4 = bcmp(pfVar10,pcVar14,(size_t)*(void **)(auStack_16af8._0_8_ + 0x10));
      if (iVar4 != 0) goto LAB_001108b3;
      pfStack_16b20 = (fdb_kvs_handle *)0x1102c4;
      fdb_doc_free((fdb_doc *)_Var23._M_i);
      handle_00 = (fdb_kvs_handle *)&(handle_00->kvs_config).field_0x1;
      doc._M_i = _Var23._M_i;
    } while (handle_00 != (fdb_kvs_handle *)0x2710);
    pfStack_16b20 = (fdb_kvs_handle *)0x1102de;
    fdb_close((fdb_file_handle *)auStack_16b10);
    pcVar28 = auStack_16ae8;
    pfStack_16b20 = (fdb_kvs_handle *)0x1102f7;
    fVar3 = fdb_open((fdb_file_handle **)pcVar28,"compact_test_less",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001108ff;
    pfStack_16b20 = (fdb_kvs_handle *)0x110313;
    pcVar28 = (char *)auStack_16ae8._0_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_16ae8._0_8_,
                       (fdb_kvs_handle **)&aStack_16aa8.seqtree,&fStack_16ad8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110904;
    uStack_16a5a = uStack_16a5a & 0xff;
    pcVar28 = auStack_16af8 + 8;
    pfStack_16b20 = (fdb_kvs_handle *)0x110338;
    fVar3 = fdb_open((fdb_file_handle **)pcVar28,"compact_test_non",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110909;
    pfStack_16b20 = (fdb_kvs_handle *)0x110354;
    pcVar28 = (char *)auStack_16af8._8_8_;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_16af8._8_8_,(fdb_kvs_handle **)&_Stack_16ab0,
                       &fStack_16ad8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011090e;
    uStack_16a5a = uStack_16a5a & 0xff00;
    pcVar28 = auStack_16b00;
    pfStack_16b20 = (fdb_kvs_handle *)0x110379;
    fVar3 = fdb_open((fdb_file_handle **)pcVar28,"compact_test_manual",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110913;
    pfStack_16b20 = (fdb_kvs_handle *)0x110395;
    pcVar28 = (char *)auStack_16b00;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_16b00,(fdb_kvs_handle **)&aStack_16ab8.seqtree,
                       &fStack_16ad8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110918;
    uStack_16a5a = 0x1e01;
    pcVar28 = auStack_16b10;
    pfStack_16b20 = (fdb_kvs_handle *)0x1103bc;
    fVar3 = fdb_open((fdb_file_handle **)pcVar28,"compact_test",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011091d;
    pfStack_16b20 = (fdb_kvs_handle *)0x1103d8;
    pcVar28 = (char *)auStack_16b10;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_16b10,(fdb_kvs_handle **)auStack_16b08,
                       &fStack_16ad8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110922;
    pfStack_16b20 = (fdb_kvs_handle *)0x1103f8;
    pcVar28 = (char *)auStack_16b08;
    fVar3 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_16b08,logCallbackFunc,"compaction_daemon_test");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110927;
    _Var23._M_i = 0;
    pfStack_16b20 = (fdb_kvs_handle *)0x110416;
    printf("wait for %d seconds..\n");
    pcVar14 = auStack_16990;
    pfStack_16b20 = (fdb_kvs_handle *)0x110428;
    gettimeofday((timeval *)pcVar14,(__timezone_ptr_t)0x0);
    tVar32.tv_usec = auStack_16990._8_8_;
    tVar32.tv_sec = auStack_16990._0_8_;
    handle_00 = (fdb_kvs_handle *)auStack_16a98;
    while( true ) {
      pfStack_16b20 = (fdb_kvs_handle *)0x110449;
      fdb_set((fdb_kvs_handle *)auStack_16b08,
              *(fdb_doc **)(&afStack_16628[0].kvs_config.create_if_missing + _Var23._M_i * 8));
      pfStack_16b20 = (fdb_kvs_handle *)0x110455;
      fdb_commit((fdb_file_handle *)auStack_16b10,'\0');
      if ((ushort)((ushort)((short)_Var23._M_i * 0x5c29) >> 2 | (short)_Var23._M_i * 0x4000) < 0x290
         ) {
        pfStack_16b20 = (fdb_kvs_handle *)0x11047c;
        fdb_set((fdb_kvs_handle *)aStack_16aa8.seqtree,
                *(fdb_doc **)(&afStack_16628[0].kvs_config.create_if_missing + _Var23._M_i * 8));
        pfStack_16b20 = (fdb_kvs_handle *)0x110488;
        fdb_commit((fdb_file_handle *)auStack_16ae8._0_8_,'\0');
      }
      pfStack_16b20 = (fdb_kvs_handle *)0x11049a;
      fdb_set((fdb_kvs_handle *)_Stack_16ab0._M_i,
              *(fdb_doc **)(&afStack_16628[0].kvs_config.create_if_missing + _Var23._M_i * 8));
      pfStack_16b20 = (fdb_kvs_handle *)0x1104a6;
      fdb_commit((fdb_file_handle *)auStack_16af8._8_8_,'\0');
      pfStack_16b20 = (fdb_kvs_handle *)0x1104b8;
      fdb_set((fdb_kvs_handle *)aStack_16ab8.seqtree,
              *(fdb_doc **)(&afStack_16628[0].kvs_config.create_if_missing + _Var23._M_i * 8));
      pfStack_16b20 = (fdb_kvs_handle *)0x1104c4;
      fdb_commit((fdb_file_handle *)auStack_16b00,'\0');
      pfStack_16b20 = (fdb_kvs_handle *)0x1104ce;
      gettimeofday((timeval *)handle_00,(__timezone_ptr_t)0x0);
      pfStack_16b20 = (fdb_kvs_handle *)0x1104e9;
      tVar31 = _utime_gap(tVar32,(timeval)auStack_16a98);
      if ((ulong)auStack_16ae8._8_8_ <= (fdb_kvs_handle *)tVar31.tv_sec) break;
      _Var23._M_i = (__int_type_conflict)&(((fdb_kvs_handle *)_Var23._M_i)->kvs_config).field_0x1;
      if ((undefined1 *)_Var23._M_i == (undefined1 *)0x2710) {
        _Var23._M_i = 0;
      }
    }
    pfStack_16b20 = (fdb_kvs_handle *)0x110517;
    pcVar28 = (char *)auStack_16b10;
    fVar3 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_16b10,0x3c);
    ptr_fhandle = (filemgr *)auStack_16990._0_8_;
    pfVar12 = (fdb_kvs_handle *)auStack_16990._8_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011092c;
    pfStack_16b20 = (fdb_kvs_handle *)0x11052e;
    pcVar28 = (char *)auStack_16b10;
    fVar3 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_16b10,1);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110931;
    pfStack_16b20 = (fdb_kvs_handle *)0x110542;
    pcVar28 = (char *)auStack_16af8._8_8_;
    fVar3 = fdb_compact((fdb_file_handle *)auStack_16af8._8_8_,(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110936;
    pfStack_16b20 = (fdb_kvs_handle *)0x11055b;
    pcVar28 = (char *)auStack_16b00;
    fVar3 = fdb_compact((fdb_file_handle *)auStack_16b00,"compact_test_manual_compacted");
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011093b;
    uStack_16a5a = uStack_16a5a & 0xff00;
    pcVar28 = auStack_16aa0;
    pfStack_16b20 = (fdb_kvs_handle *)0x110580;
    fVar3 = fdb_open((fdb_file_handle **)pcVar28,"compact_test_manual_compacted",
                     (fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110940;
    pfStack_16b20 = (fdb_kvs_handle *)0x11059c;
    pcVar28 = (char *)auStack_16b00;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_16b00,'\x01',0x1e);
    if (fVar3 != FDB_RESULT_FILE_IS_BUSY) goto LAB_00110945;
    pfStack_16b20 = (fdb_kvs_handle *)0x1105af;
    fVar3 = fdb_close((fdb_file_handle *)auStack_16aa0);
    pcVar28 = (char *)auStack_16aa0;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011094a;
    pfStack_16b20 = (fdb_kvs_handle *)0x1105cb;
    pcVar28 = (char *)auStack_16b00;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_16b00,'\x01',10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011094f;
    pfStack_16b20 = (fdb_kvs_handle *)0x1105e7;
    pcVar28 = (char *)auStack_16b00;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_16b00,'\x01',0x1e);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110954;
    pfStack_16b20 = (fdb_kvs_handle *)0x1105f9;
    pcVar28 = (char *)auStack_16b00;
    fVar3 = fdb_close((fdb_file_handle *)auStack_16b00);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110959;
    uStack_16a5a = CONCAT11(uStack_16a5a._1_1_,1);
    pcVar28 = auStack_16b00;
    pfStack_16b20 = (fdb_kvs_handle *)0x11061e;
    fVar3 = fdb_open((fdb_file_handle **)pcVar28,"compact_test_manual_compacted",
                     (fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011095e;
    pfStack_16b20 = (fdb_kvs_handle *)0x110634;
    pcVar28 = (char *)auStack_16af8._8_8_;
    fVar3 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_16af8._8_8_,'\0',0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110963;
    pfStack_16b20 = (fdb_kvs_handle *)0x110646;
    pcVar28 = (char *)auStack_16af8._8_8_;
    fVar3 = fdb_close((fdb_file_handle *)auStack_16af8._8_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110968;
    uStack_16a5a = uStack_16a5a & 0xff00;
    pcVar28 = auStack_16af8 + 8;
    pfStack_16b20 = (fdb_kvs_handle *)0x11066b;
    fVar3 = fdb_open((fdb_file_handle **)pcVar28,"compact_test_non",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011096d;
    pcVar14 = "compact_test_non.manual";
    pfStack_16b20 = (fdb_kvs_handle *)0x110687;
    fdb_compact((fdb_file_handle *)auStack_16af8._8_8_,"compact_test_non.manual");
    ptr_fhandle = (filemgr *)auStack_16b10;
    pfStack_16b20 = (fdb_kvs_handle *)0x110694;
    fdb_close((fdb_file_handle *)auStack_16b10);
    pfStack_16b20 = (fdb_kvs_handle *)0x11069e;
    fdb_close((fdb_file_handle *)auStack_16ae8._0_8_);
    pfStack_16b20 = (fdb_kvs_handle *)0x1106a8;
    fdb_close((fdb_file_handle *)auStack_16b00);
    uStack_16a5a = CONCAT11(uStack_16a5a._1_1_,1);
    pfStack_16b20 = (fdb_kvs_handle *)0x1106bf;
    pcVar28 = (char *)ptr_fhandle;
    fVar3 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non.manual",
                     (fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110972;
    pcVar28 = "compact_test_non.manual";
    pfStack_16b20 = (fdb_kvs_handle *)0x1106dc;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110977;
    uStack_16a5a = uStack_16a5a & 0xff00;
    pcVar28 = auStack_16b10;
    pfStack_16b20 = (fdb_kvs_handle *)0x110702;
    fVar3 = fdb_open((fdb_file_handle **)pcVar28,"compact_test_manual_compacted",
                     (fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_0011097c;
    pcVar28 = "compact_test_manual_compacted";
    pfStack_16b20 = (fdb_kvs_handle *)0x11071f;
    fVar3 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110981;
    uStack_16a5a = CONCAT11(uStack_16a5a._1_1_,1);
    pcVar28 = "compact_test_manual_compacted";
    pfStack_16b20 = (fdb_kvs_handle *)0x110740;
    fVar3 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110986;
    uStack_16a5a = uStack_16a5a & 0xff00;
    pcVar28 = "compact_test_non.manual";
    pfStack_16b20 = (fdb_kvs_handle *)0x110760;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011098b;
    pfStack_16b20 = (fdb_kvs_handle *)0x110773;
    fdb_close((fdb_file_handle *)auStack_16af8._8_8_);
    pfStack_16b20 = (fdb_kvs_handle *)0x110778;
    fVar3 = fdb_shutdown();
    pcVar28 = (char *)auStack_16af8._8_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110990;
    pcVar28 = "compact_test_non.manual";
    pfStack_16b20 = (fdb_kvs_handle *)0x110794;
    fVar3 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110995;
    fStack_16a64 = 2;
    pcVar28 = auStack_16b10;
    pfStack_16b20 = (fdb_kvs_handle *)0x1107bc;
    fVar3 = fdb_open((fdb_file_handle **)pcVar28,"./compact_test_manual_compacted",
                     (fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099a;
    pcVar28 = auStack_16b10;
    pfStack_16b20 = (fdb_kvs_handle *)0x1107de;
    fVar3 = fdb_open((fdb_file_handle **)pcVar28,"./compact_test_manual_compacted.meta",
                     (fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099f;
    pcVar28 = auStack_16b10;
    pfStack_16b20 = (fdb_kvs_handle *)0x110800;
    fVar3 = fdb_open((fdb_file_handle **)pcVar28,"compact_test_non",(fdb_config *)auStack_16a88);
    if (fVar3 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001109a4;
    pcVar28 = auStack_16b10;
    pfStack_16b20 = (fdb_kvs_handle *)0x110822;
    fVar3 = fdb_open((fdb_file_handle **)pcVar28,"compact_test_non.manual",
                     (fdb_config *)auStack_16a88);
    if (fVar3 == FDB_RESULT_NO_SUCH_FILE) {
      lVar24 = 0;
      do {
        pfStack_16b20 = (fdb_kvs_handle *)0x11083a;
        fdb_doc_free(*(fdb_doc **)(&afStack_16628[0].kvs_config.create_if_missing + lVar24 * 8));
        lVar24 = lVar24 + 1;
      } while (lVar24 != 10000);
      pfStack_16b20 = (fdb_kvs_handle *)0x11084b;
      fdb_shutdown();
      pfStack_16b20 = (fdb_kvs_handle *)0x110850;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pfStack_16b20 = (fdb_kvs_handle *)0x110881;
      fprintf(_stderr,pcVar14,"compaction daemon test");
      return;
    }
  }
  else {
LAB_001108c3:
    pfStack_16b20 = (fdb_kvs_handle *)0x1108c8;
    compaction_daemon_test();
LAB_001108c8:
    pfStack_16b20 = (fdb_kvs_handle *)0x1108cd;
    compaction_daemon_test();
LAB_001108cd:
    pfStack_16b20 = (fdb_kvs_handle *)0x1108d2;
    compaction_daemon_test();
LAB_001108d2:
    pfStack_16b20 = (fdb_kvs_handle *)0x1108d7;
    compaction_daemon_test();
LAB_001108d7:
    pfStack_16b20 = (fdb_kvs_handle *)0x1108dc;
    compaction_daemon_test();
LAB_001108dc:
    pfStack_16b20 = (fdb_kvs_handle *)0x1108e1;
    compaction_daemon_test();
LAB_001108e1:
    pfStack_16b20 = (fdb_kvs_handle *)0x1108e6;
    compaction_daemon_test();
LAB_001108e6:
    pfStack_16b20 = (fdb_kvs_handle *)0x1108eb;
    compaction_daemon_test();
    _Var23._M_i = doc._M_i;
LAB_001108eb:
    pfStack_16b20 = (fdb_kvs_handle *)0x1108f0;
    compaction_daemon_test();
LAB_001108f0:
    pfStack_16b20 = (fdb_kvs_handle *)0x1108f5;
    compaction_daemon_test();
LAB_001108f5:
    pfStack_16b20 = (fdb_kvs_handle *)0x1108fa;
    compaction_daemon_test();
LAB_001108fa:
    pfStack_16b20 = (fdb_kvs_handle *)0x1108ff;
    compaction_daemon_test();
LAB_001108ff:
    pfStack_16b20 = (fdb_kvs_handle *)0x110904;
    compaction_daemon_test();
LAB_00110904:
    pfStack_16b20 = (fdb_kvs_handle *)0x110909;
    compaction_daemon_test();
LAB_00110909:
    pfStack_16b20 = (fdb_kvs_handle *)0x11090e;
    compaction_daemon_test();
LAB_0011090e:
    pfStack_16b20 = (fdb_kvs_handle *)0x110913;
    compaction_daemon_test();
LAB_00110913:
    pfStack_16b20 = (fdb_kvs_handle *)0x110918;
    compaction_daemon_test();
LAB_00110918:
    pfStack_16b20 = (fdb_kvs_handle *)0x11091d;
    compaction_daemon_test();
LAB_0011091d:
    pfStack_16b20 = (fdb_kvs_handle *)0x110922;
    compaction_daemon_test();
LAB_00110922:
    pfStack_16b20 = (fdb_kvs_handle *)0x110927;
    compaction_daemon_test();
LAB_00110927:
    pfStack_16b20 = (fdb_kvs_handle *)0x11092c;
    compaction_daemon_test();
LAB_0011092c:
    pfStack_16b20 = (fdb_kvs_handle *)0x110931;
    compaction_daemon_test();
LAB_00110931:
    pfStack_16b20 = (fdb_kvs_handle *)0x110936;
    compaction_daemon_test();
LAB_00110936:
    pfStack_16b20 = (fdb_kvs_handle *)0x11093b;
    compaction_daemon_test();
LAB_0011093b:
    pfStack_16b20 = (fdb_kvs_handle *)0x110940;
    compaction_daemon_test();
LAB_00110940:
    pfStack_16b20 = (fdb_kvs_handle *)0x110945;
    compaction_daemon_test();
LAB_00110945:
    pfStack_16b20 = (fdb_kvs_handle *)0x11094a;
    compaction_daemon_test();
LAB_0011094a:
    pfStack_16b20 = (fdb_kvs_handle *)0x11094f;
    compaction_daemon_test();
LAB_0011094f:
    pfStack_16b20 = (fdb_kvs_handle *)0x110954;
    compaction_daemon_test();
LAB_00110954:
    pfStack_16b20 = (fdb_kvs_handle *)0x110959;
    compaction_daemon_test();
LAB_00110959:
    pfStack_16b20 = (fdb_kvs_handle *)0x11095e;
    compaction_daemon_test();
LAB_0011095e:
    pfStack_16b20 = (fdb_kvs_handle *)0x110963;
    compaction_daemon_test();
LAB_00110963:
    pfStack_16b20 = (fdb_kvs_handle *)0x110968;
    compaction_daemon_test();
LAB_00110968:
    pfStack_16b20 = (fdb_kvs_handle *)0x11096d;
    compaction_daemon_test();
LAB_0011096d:
    pfStack_16b20 = (fdb_kvs_handle *)0x110972;
    compaction_daemon_test();
LAB_00110972:
    pfStack_16b20 = (fdb_kvs_handle *)0x110977;
    compaction_daemon_test();
LAB_00110977:
    pfStack_16b20 = (fdb_kvs_handle *)0x11097c;
    compaction_daemon_test();
LAB_0011097c:
    pfStack_16b20 = (fdb_kvs_handle *)0x110981;
    compaction_daemon_test();
LAB_00110981:
    pfStack_16b20 = (fdb_kvs_handle *)0x110986;
    compaction_daemon_test();
LAB_00110986:
    pfStack_16b20 = (fdb_kvs_handle *)0x11098b;
    compaction_daemon_test();
LAB_0011098b:
    pfStack_16b20 = (fdb_kvs_handle *)0x110990;
    compaction_daemon_test();
LAB_00110990:
    pfStack_16b20 = (fdb_kvs_handle *)0x110995;
    compaction_daemon_test();
LAB_00110995:
    pfStack_16b20 = (fdb_kvs_handle *)0x11099a;
    compaction_daemon_test();
LAB_0011099a:
    pfStack_16b20 = (fdb_kvs_handle *)0x11099f;
    compaction_daemon_test();
LAB_0011099f:
    pfStack_16b20 = (fdb_kvs_handle *)0x1109a4;
    compaction_daemon_test();
LAB_001109a4:
    pfStack_16b20 = (fdb_kvs_handle *)0x1109a9;
    compaction_daemon_test();
  }
  pfStack_16b20 = (fdb_kvs_handle *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_16cb8 = (fdb_kvs_handle *)0x1109ce;
  pfStack_16b48 = (filemgr *)pcVar14;
  pfStack_16b40 = handle_00;
  pfStack_16b38 = (fdb_kvs_handle *)_Var23._M_i;
  pfStack_16b30 = ptr_fhandle;
  pfStack_16b28 = pfVar12;
  pfStack_16b20 = pfVar10;
  gettimeofday(&tStack_16c68,(__timezone_ptr_t)0x0);
  pfStack_16cb8 = (fdb_kvs_handle *)0x1109d3;
  memleak_start();
  pfStack_16cb8 = (fdb_kvs_handle *)0x1109df;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_16cb8 = (fdb_kvs_handle *)0x1109ec;
  fdb_get_default_config();
  uStack_16c12 = 1;
  uStack_16c08._0_2_ = 1;
  uStack_16c08._2_2_ = 0;
  uStack_16c08._4_4_ = 0;
  pfStack_16cb8 = (fdb_kvs_handle *)0x110a0d;
  fVar3 = fdb_open(&pfStack_16ca8,"compact_test",(fdb_config *)(auStack_16c58 + 0x18));
  pfVar25 = (fdb_config *)(auStack_16c58 + 0x18);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfVar25 = (fdb_config *)auStack_16c58;
    pfStack_16cb8 = (fdb_kvs_handle *)0x110a22;
    fdb_get_default_kvs_config();
    pfStack_16cb8 = (fdb_kvs_handle *)0x110a34;
    fVar3 = fdb_kvs_open_default(pfStack_16ca8,&pfStack_16ca0,(fdb_kvs_config *)pfVar25);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110b65;
    pfStack_16cb8 = (fdb_kvs_handle *)0x110a4b;
    gettimeofday(&tStack_16c78,(__timezone_ptr_t)0x0);
    pfStack_16cb8 = (fdb_kvs_handle *)0x110a5b;
    printf("wait for %d seconds..\n",(ulong)pcVar28 & 0xffffffff);
    tVar31.tv_usec = tStack_16c78.tv_usec;
    tVar31.tv_sec = tStack_16c78.tv_sec;
    _Var23._M_i = (long)&atStack_16c98[1].tv_sec + 1;
    pfVar10 = (fdb_kvs_handle *)0x0;
    do {
      iVar4 = (int)pfVar10;
      pfStack_16cb8 = (fdb_kvs_handle *)0x110a7c;
      sprintf((char *)_Var23._M_i,"%d",pfVar10);
      handle_00 = pfStack_16ca0;
      pfStack_16cb8 = (fdb_kvs_handle *)0x110a89;
      sVar5 = strlen((char *)_Var23._M_i);
      pfStack_16cb8 = (fdb_kvs_handle *)0x110aa4;
      fVar3 = fdb_set_kv(handle_00,(void *)_Var23._M_i,sVar5,"value",5);
      pfVar25 = (fdb_config *)tStack_16c78.tv_sec;
      pfVar12 = (fdb_kvs_handle *)tStack_16c78.tv_usec;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00110b5b:
        pfStack_16cb8 = (fdb_kvs_handle *)0x110b60;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b60;
      }
      pfStack_16cb8 = (fdb_kvs_handle *)0x110ab8;
      fVar3 = fdb_commit(pfStack_16ca8,'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_16cb8 = (fdb_kvs_handle *)0x110b5b;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b5b;
      }
      pfStack_16cb8 = (fdb_kvs_handle *)0x110acc;
      gettimeofday((timeval *)atStack_16c98,(__timezone_ptr_t)0x0);
      pfStack_16cb8 = (fdb_kvs_handle *)0x110ae1;
      tVar32 = _utime_gap(tVar31,atStack_16c98[0]);
    } while (((filemgr *)tVar32.tv_sec < pcVar28) &&
            (pfVar10 = (fdb_kvs_handle *)(ulong)(iVar4 + 1), iVar4 != 99999));
    pfStack_16cb8 = (fdb_kvs_handle *)0x110b01;
    fVar3 = fdb_close(pfStack_16ca8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110b6a;
    pfStack_16cb8 = (fdb_kvs_handle *)0x110b0a;
    fVar3 = fdb_shutdown();
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_16cb8 = (fdb_kvs_handle *)0x110b13;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pfStack_16cb8 = (fdb_kvs_handle *)0x110b44;
      fprintf(_stderr,pcVar14,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110b60:
    pfStack_16cb8 = (fdb_kvs_handle *)0x110b65;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b65:
    pfStack_16cb8 = (fdb_kvs_handle *)0x110b6a;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b6a:
    pfStack_16cb8 = (fdb_kvs_handle *)0x110b6f;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_16cb8 = (fdb_kvs_handle *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_16ce0 = (filemgr *)pcVar28;
  pfStack_16cd8 = handle_00;
  pfStack_16cd0 = (fdb_kvs_handle *)_Var23._M_i;
  pfStack_16cc8 = pfVar25;
  pfStack_16cc0 = pfVar12;
  pfStack_16cb8 = pfVar10;
  gettimeofday(&tStack_16fe8,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_17058._32_8_ = (btree *)0x0;
  auStack_17058._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_16dd8.wal_threshold = 0x1000;
  fStack_16dd8.compaction_mode = '\x01';
  fStack_16dd8.compaction_threshold = '\n';
  fStack_16dd8.compactor_sleep_duration = 1;
  info = (fdb_file_info *)0x14d0c5;
  pfVar10 = (fdb_kvs_handle *)&pfStack_17078;
  kvs_config_01 = (fdb_file_info *)0x1;
  fVar3 = fdb_open_custom_cmp((fdb_file_handle **)pfVar10,"compact_test",&fStack_16dd8,1,
                              (char **)(auStack_17058 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_17058 + 0x18),(void **)0x0);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_17058._16_8_ = afStack_16fd8[0].doc_count;
    auStack_17058._0_8_ = afStack_16fd8[0].filename;
    auStack_17058._8_8_ = afStack_16fd8[0].new_filename;
    info = (fdb_file_info *)auStack_17070;
    pfVar10 = pfStack_17078;
    fVar3 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_17078,(fdb_kvs_handle **)info,
                       (fdb_kvs_config *)auStack_17058);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f6c;
    info = (fdb_file_info *)auStack_17060;
    kvs_config_01 = (fdb_file_info *)auStack_17058;
    pfVar10 = pfStack_17078;
    fVar3 = fdb_kvs_open((fdb_file_handle *)pfStack_17078,(fdb_kvs_handle **)info,"db",
                         (fdb_kvs_config *)kvs_config_01);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f71;
    uVar22 = 0;
    do {
      sprintf((char *)afStack_16fd8,"key%06d",uVar22);
      sprintf((char *)afStack_16ed8,"body%06d",uVar22);
      pfVar10 = (fdb_kvs_handle *)auStack_17070._0_8_;
      sVar5 = strlen((char *)afStack_16fd8);
      sVar6 = strlen((char *)afStack_16ed8);
      kvs_config_01 = afStack_16ed8;
      info = afStack_16fd8;
      fVar3 = fdb_set_kv(pfVar10,afStack_16fd8,sVar5,afStack_16ed8,sVar6);
      handle = auStack_17060;
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00110f53:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110f58;
      }
      sVar5 = strlen((char *)afStack_16fd8);
      sVar6 = strlen((char *)afStack_16ed8);
      kvs_config_01 = afStack_16ed8;
      info = afStack_16fd8;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)handle,afStack_16fd8,sVar5,afStack_16ed8,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar10 = (fdb_kvs_handle *)handle;
        goto LAB_00110f53;
      }
      uVar18 = (int)uVar22 + 1;
      uVar22 = (ulong)uVar18;
    } while (uVar18 != 10000);
    kvs_config_01 = (fdb_file_info *)auStack_17058;
    auStack_17058._8_8_ = _compact_test_keycmp;
    info = (fdb_file_info *)(auStack_17070 + 8);
    pfVar10 = pfStack_17078;
    fVar3 = fdb_kvs_open((fdb_file_handle *)pfStack_17078,(fdb_kvs_handle **)info,"db_custom",
                         (fdb_kvs_config *)kvs_config_01);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f76;
    info = afStack_16fd8;
    sprintf((char *)info,"key%06d",0);
    kvs_config_01 = afStack_16ed8;
    sprintf((char *)kvs_config_01,"body%06d",0);
    sVar5 = strlen((char *)info);
    sVar6 = strlen((char *)kvs_config_01);
    fVar3 = fdb_set_kv((fdb_kvs_handle *)auStack_17070._8_8_,info,sVar5,kvs_config_01,sVar6);
    pfVar10 = (fdb_kvs_handle *)auStack_17070._8_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f7b;
    info = (fdb_file_info *)0x0;
    pfVar10 = pfStack_17078;
    fVar3 = fdb_commit((fdb_file_handle *)pfStack_17078,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f80;
    uVar22 = 0;
    uVar26 = 0;
    do {
      sprintf((char *)afStack_16fd8,"key%06d",uVar26);
      sprintf((char *)afStack_16ed8,"body%06d",uVar26);
      pfVar10 = (fdb_kvs_handle *)auStack_17070._0_8_;
      sVar5 = strlen((char *)afStack_16fd8);
      sVar6 = strlen((char *)afStack_16ed8);
      kvs_config_01 = afStack_16ed8;
      info = afStack_16fd8;
      fVar3 = fdb_set_kv(pfVar10,afStack_16fd8,sVar5,afStack_16ed8,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      info = (fdb_file_info *)(auStack_17058 + 0x28);
      pfVar10 = pfStack_17078;
      fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_17078,info);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f58;
      if (uVar22 < uStack_17008) {
        uVar22 = uStack_17008;
      }
      uVar18 = (int)uVar26 + 1;
      uVar26 = (ulong)uVar18;
    } while (uVar18 != 10000);
    info = (fdb_file_info *)0x0;
    pfVar10 = pfStack_17078;
    fVar3 = fdb_commit((fdb_file_handle *)pfStack_17078,'\0');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f85;
    info = (fdb_file_info *)(auStack_17058 + 0x28);
    pfVar10 = pfStack_17078;
    fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_17078,info);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f8a;
    if (uVar22 < uStack_17008) {
      uVar22 = uStack_17008;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar22);
    do {
      sleep(1);
      info = (fdb_file_info *)(auStack_17058 + 0x28);
      pfVar10 = pfStack_17078;
      fVar3 = fdb_get_file_info((fdb_file_handle *)pfStack_17078,
                                (fdb_file_info *)(auStack_17058 + 0x28));
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00110f62;
    } while (uVar22 <= uStack_17008);
    fVar3 = fdb_close((fdb_file_handle *)pfStack_17078);
    pfVar10 = pfStack_17078;
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_shutdown();
      pfVar10 = pfStack_17078;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar14 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar14 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar14,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110f94;
    }
  }
  else {
LAB_00110f67:
    auto_compaction_with_custom_cmp_function();
LAB_00110f6c:
    auto_compaction_with_custom_cmp_function();
LAB_00110f71:
    auto_compaction_with_custom_cmp_function();
LAB_00110f76:
    auto_compaction_with_custom_cmp_function();
LAB_00110f7b:
    auto_compaction_with_custom_cmp_function();
LAB_00110f80:
    auto_compaction_with_custom_cmp_function();
LAB_00110f85:
    auto_compaction_with_custom_cmp_function();
LAB_00110f8a:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110f94:
  auto_compaction_with_custom_cmp_function();
  if (info == kvs_config_01) {
    memcmp(pfVar10,__s2,(size_t)info);
    return;
  }
  if (info < kvs_config_01) {
    kvs_config_01 = info;
  }
  memcmp(pfVar10,__s2,(size_t)kvs_config_01);
  return;
LAB_0010eb2a:
  pfStack_13a8 = (fdb_kvs_handle *)0x10eb2f;
  compact_upto_test();
  pcVar29 = pcVar28;
LAB_0010eb2f:
  pfStack_13a8 = (fdb_kvs_handle *)0x10eb34;
  compact_upto_test();
LAB_0010eb34:
  pfStack_13a8 = (fdb_kvs_handle *)0x10eb39;
  compact_upto_test();
LAB_0010eb39:
  pfStack_13a8 = (fdb_kvs_handle *)0x10eb3e;
  compact_upto_test();
LAB_0010eb3e:
  pfStack_13a8 = (fdb_kvs_handle *)0x10eb43;
  compact_upto_test();
  goto LAB_0010eb43;
LAB_001108a3:
  pfStack_16b20 = (fdb_kvs_handle *)0x1108ae;
  compaction_daemon_test();
  doc._M_i = _Var23._M_i;
LAB_001108ae:
  _Var23._M_i = doc._M_i;
  pfStack_16b20 = (fdb_kvs_handle *)0x1108b3;
  compaction_daemon_test();
LAB_001108b3:
  pfStack_16b20 = (fdb_kvs_handle *)0x1108be;
  pcVar28 = pcVar14;
  compaction_daemon_test();
  doc._M_i = _Var23._M_i;
LAB_001108be:
  pfVar12 = (fdb_kvs_handle *)auStack_16af8;
  ptr_fhandle = (filemgr *)(auStack_16970 + 0x48);
  pfStack_16b20 = (fdb_kvs_handle *)0x1108c3;
  compaction_daemon_test();
  goto LAB_001108c3;
LAB_00110f58:
  auto_compaction_with_custom_cmp_function();
LAB_00110f5d:
  auto_compaction_with_custom_cmp_function();
LAB_00110f62:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110f67;
}

Assistant:

void estimate_space_upto_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, j, r;
    int n = 300;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;
    fdb_snapshot_info_t *markers;
    uint64_t num_markers;
    size_t space_used;

    char keybuf[256], metabuf[256], bodybuf[256];
    char kv_name[8];

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 50;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    fconfig.block_reusing_threshold = 0;

    // remove previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

   // ------- Setup test ----------------------------------
   // insert first quarter of documents
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert second quarter of documents
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // Update first quarter of documents again..
    for (j = 0; j < n/4; j++){
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[j]);
        }
    }
    // Update first quarter of documents again overwriting previous update..
    for (j = 0; j < n/4; j++){
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[j]);
        }
    }

    // commit again without a WAL flush (some of these docs remain in WAL)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert third quarter of documents
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert fourth quarter of documents
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush (some of these docs remain in the WAL)
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "estimate_space_upto_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    if (!multi_kv) {
        size_t space_used2;
        TEST_CHK(num_markers == 4);
        space_used = fdb_estimate_space_used_from(dbfile, markers[1].marker);
        space_used2 = fdb_estimate_space_used_from(dbfile, markers[2].marker);
        TEST_CHK(space_used2 > space_used); // greater than space used by just 1
    } else {
        size_t space_used2;
        TEST_CHK(num_markers == 8);
        space_used = fdb_estimate_space_used_from(dbfile, markers[1].marker);
        space_used2 = fdb_estimate_space_used_from(dbfile, markers[2].marker);
        TEST_CHK(space_used2 > space_used); // greater than space used by just 1
    }

    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "estimate space upto marker in file test %s", multi_kv ?
                                                           "multiple kv mode:"
                                                         : "single kv mode:");
    TEST_RESULT(bodybuf);
}